

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_tests.cpp
# Opt level: O1

void (anonymous_namespace)::run_tests<false,6>(void)

{
  rrb<char,_false,_6> *prVar1;
  _Tuple_impl<2UL,_unsigned_int> _Var2;
  undefined8 uVar3;
  undefined1 auVar4 [8];
  undefined4 uVar5;
  pointer pvVar6;
  bool bVar7;
  int iVar8;
  _Head_base<2UL,_unsigned_int,_false> _Var9;
  ulong uVar10;
  void *pvVar11;
  int *piVar12;
  const_reference piVar13;
  void *pvVar14;
  void *pvVar15;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Var16;
  void *pvVar17;
  reference piVar18;
  reference piVar19;
  const_reference piVar20;
  ulong uVar21;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> *p_Var22;
  reference pcVar23;
  ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> __dest;
  uint uVar24;
  uint uVar25;
  char *__function;
  leaf_node<immutable::vector<char,_false,_6>,_true> *plVar26;
  leaf_node<immutable::vector<char,_false,_6>,_true> *plVar27;
  uint32_t i_2;
  long lVar28;
  int *piVar29;
  long lVar30;
  uint32_t i_15;
  uint32_t index;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Var31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  undefined8 *puVar37;
  long *plVar38;
  uint32_t i;
  int iVar39;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Var40;
  uint32_t i_1;
  value_type_conflict *__val;
  ulong uVar41;
  value_type_conflict *__val_5;
  vector<char,_false,_6> text;
  vector<int,_false,_6> v3;
  vector<int,_false,_6> old_vec;
  vector<char,_false,_6> buf1;
  transient_type tvec_1;
  transient_type buf1_tr;
  iterator __end0;
  vector<char,_false,_6> new_buf;
  vector<char,_false,_6> buf2;
  persistent_type cat_pushed;
  transient_type buf2_tr;
  vector<int,_false,_6> v;
  iterator __end2;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_2e0;
  undefined1 local_2d8 [16];
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Stack_2c8;
  _Head_base<0UL,_const_int_*,_false> local_2c0;
  undefined1 local_2b8 [8];
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Stack_2b0;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_2a8;
  _Head_base<0UL,_const_int_*,_false> local_2a0;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_290;
  undefined1 local_288 [16];
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Stack_278;
  _Head_base<0UL,_const_int_*,_false> local_270;
  void *local_268;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_260;
  void *local_258;
  vector_iterator<char,_false,_6> local_250;
  void *local_230;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_228;
  char local_219;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_218;
  void *local_210;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_208;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_200;
  undefined1 local_1f8 [8];
  pointer pvStack_1f0;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_1e8;
  _Head_base<0UL,_const_int_*,_false> local_1e0;
  ios_base local_178 [264];
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_50;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_48;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_40;
  ref<immutable::transient_rrb<int,_false,_6>_> local_38;
  
  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_1f8);
  if (((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8 !=
       (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) &&
     (TestEq<bool,bool>(true,*(uint *)local_1f8 == 0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0xf,
                        "void (anonymous namespace)::test_empty_vector() [atomic_ref_counting = false, N = 6]"
                       ),
     (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8 !=
     (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)) {
    TestEq<int,unsigned_int>
              (0,*(uint *)local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
               ,0x10,
               "void (anonymous namespace)::test_empty_vector() [atomic_ref_counting = false, N = 6]"
              );
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_1f8);
    immutable::vector<int,_false,_6>::push_back
              ((vector<int,_false,_6> *)local_2d8,
               (value_type_conflict)(vector<int,_false,_6> *)local_1f8);
    immutable::vector<int,_false,_6>::push_back
              ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
    if (((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8 !=
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) &&
       ((((TestEq<bool,bool>(true,*(uint *)local_1f8 == 0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                             ,0x19,
                             "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                            ),
          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8 !=
          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0 &&
          (TestEq<int,unsigned_int>
                     (0,*(uint *)local_1f8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x1a,
                      "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                     ),
          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)) &&
         (TestEq<int,unsigned_int>
                    (1,*(uint *)local_2d8._0_8_,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                     ,0x1b,
                     "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                    ),
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)) &&
        (TestEq<int,unsigned_int>
                   (2,*(uint *)local_2b8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1c,
                    "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                   ),
        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)))) {
      if (*(uint *)local_2d8._0_8_ == 0) goto LAB_0012f7e6;
      if (*(uint32_t *)(local_2d8._0_8_ + 8) == *(uint *)local_2d8._0_8_) {
        plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                    *)(local_2d8._0_8_ + 0x10))->ptr;
        if (plVar26 != (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0) {
          uVar10 = 0;
          goto LAB_0012a0e5;
        }
LAB_0012b6f5:
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
        ;
        goto LAB_0012b70a;
      }
      uVar24 = *(uint32_t *)(local_2d8._0_8_ + 4);
      plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_> *
                 )(local_2d8._0_8_ + 0x18))->ptr;
      uVar25 = 0;
      if (uVar24 != 0) {
        do {
          uVar32 = uVar25 >> ((byte)uVar24 & 0x1f);
          if (plVar26->child == (vector<char,_false,_6> *)0x0) {
            puVar37 = (undefined8 *)((ulong)((uVar32 & 0x3f) << 3) + *(long *)(plVar26 + 1));
          }
          else {
            prVar1 = (plVar26->child->_impl).ptr;
            do {
              uVar33 = uVar32;
              uVar32 = uVar33 + 1;
            } while ((&prVar1->cnt)[uVar33] <= uVar25);
            if (uVar33 + 1 != 1) {
              uVar25 = uVar25 - (&prVar1->cnt)[uVar33 - 1];
            }
            puVar37 = (undefined8 *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
          }
          plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*puVar37;
          uVar24 = uVar24 - 6;
        } while (uVar24 != 0);
        uVar25 = uVar25 & 0x3f;
      }
      uVar10 = (ulong)(uVar25 << 2);
LAB_0012a0e5:
      TestEq<int,int>(3,*(int *)((long)&(plVar26->child->_impl).ptr + uVar10),
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x1d,
                      "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                     );
      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
        if (*(uint *)local_2b8 == 0) goto LAB_0012f7e6;
        if (*(uint32_t *)((long)local_2b8 + 8) == *(uint *)local_2b8) {
          plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                      *)((long)local_2b8 + 0x10))->ptr;
          if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
          goto LAB_0012b6f5;
          uVar10 = 0;
        }
        else {
          uVar24 = *(uint32_t *)((long)local_2b8 + 4);
          plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                    ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                      *)((long)local_2b8 + 0x18))->ptr;
          uVar25 = 0;
          if (uVar24 != 0) {
            do {
              uVar32 = uVar25 >> ((byte)uVar24 & 0x1f);
              if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                puVar37 = (undefined8 *)((ulong)((uVar32 & 0x3f) << 3) + *(long *)(plVar26 + 1));
              }
              else {
                prVar1 = (plVar26->child->_impl).ptr;
                do {
                  uVar33 = uVar32;
                  uVar32 = uVar33 + 1;
                } while ((&prVar1->cnt)[uVar33] <= uVar25);
                if (uVar33 + 1 != 1) {
                  uVar25 = uVar25 - (&prVar1->cnt)[uVar33 - 1];
                }
                puVar37 = (undefined8 *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
              }
              plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*puVar37;
              uVar24 = uVar24 - 6;
            } while (uVar24 != 0);
            uVar25 = uVar25 & 0x3f;
          }
          uVar10 = (ulong)(uVar25 << 2);
        }
        TestEq<int,int>(3,*(int *)((long)&(plVar26->child->_impl).ptr + uVar10),
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x1e,
                        "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                       );
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          if (*(uint *)local_2b8 < 2) {
LAB_0012f7e6:
            __assert_fail("index < rrb->cnt",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                          ,0x7c3,
                          "const T &immutable::rrb_nth(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = false, N = 6]"
                         );
          }
          uVar24 = *(uint *)local_2b8 - *(uint32_t *)((long)local_2b8 + 8);
          if (uVar24 < 2) {
            plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                        *)((long)local_2b8 + 0x10))->ptr;
            if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
            goto LAB_0012b6f5;
            uVar24 = 1 - uVar24;
          }
          else {
            uVar25 = *(uint32_t *)((long)local_2b8 + 4);
            plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                      ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                        *)((long)local_2b8 + 0x18))->ptr;
            if (uVar25 == 0) {
              uVar24 = 1;
            }
            else {
              uVar24 = 1;
              do {
                uVar32 = uVar24 >> ((byte)uVar25 & 0x1f);
                if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                  puVar37 = (undefined8 *)((ulong)((uVar32 & 0x3f) << 3) + *(long *)(plVar26 + 1));
                }
                else {
                  prVar1 = (plVar26->child->_impl).ptr;
                  do {
                    uVar33 = uVar32;
                    uVar32 = uVar33 + 1;
                  } while ((&prVar1->cnt)[uVar33] <= uVar24);
                  if (uVar33 + 1 != 1) {
                    uVar24 = uVar24 - (&prVar1->cnt)[uVar33 - 1];
                  }
                  puVar37 = (undefined8 *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
                }
                plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*puVar37;
                uVar25 = uVar25 - 6;
              } while (uVar25 != 0);
              uVar24 = uVar24 & 0x3f;
            }
          }
          TestEq<int,int>(7,*(int *)((long)&(plVar26->child->_impl).ptr + (ulong)(uVar24 << 2)),
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                          ,0x1f,
                          "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                         );
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
          pvVar11 = operator_new(160000);
          lVar28 = 0;
          memset(pvVar11,0,160000);
          do {
            iVar8 = rand();
            *(int *)((long)pvVar11 + lVar28) = iVar8;
            lVar28 = lVar28 + 4;
          } while (lVar28 != 160000);
          immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
          lVar28 = 0;
          do {
            immutable::vector<int,_false,_6>::push_back
                      ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
            local_1f8 = (undefined1  [8])local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2d8._0_8_ = local_2b8;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
            lVar28 = lVar28 + 4;
          } while (lVar28 != 160000);
          uVar10 = 0;
          do {
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
            if (*(uint *)local_2d8._0_8_ <= uVar10) goto LAB_0012f7e6;
            uVar25 = *(uint *)local_2d8._0_8_ - *(uint32_t *)(local_2d8._0_8_ + 8);
            uVar24 = (uint)uVar10;
            if (uVar10 < uVar25) {
              plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                        ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                          *)(local_2d8._0_8_ + 0x18))->ptr;
              uVar41 = uVar10 & 0xffffffff;
              for (uVar25 = *(uint32_t *)(local_2d8._0_8_ + 4); uVar25 != 0; uVar25 = uVar25 - 6) {
                uVar32 = (uint)uVar41;
                uVar24 = uVar32 >> ((byte)uVar25 & 0x1f);
                if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                  plVar38 = (long *)((ulong)((uVar24 & 0x3f) << 3) + *(long *)(plVar26 + 1));
                }
                else {
                  prVar1 = (plVar26->child->_impl).ptr;
                  do {
                    uVar33 = uVar24;
                    uVar24 = uVar33 + 1;
                  } while ((&prVar1->cnt)[uVar33] <= uVar32);
                  if (uVar33 + 1 != 1) {
                    uVar41 = (ulong)(uVar32 - (&prVar1->cnt)[uVar33 - 1]);
                  }
                  plVar38 = (long *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
                }
                uVar24 = (uint)uVar41;
                plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38;
              }
              uVar24 = uVar24 & 0x3f;
            }
            else {
              plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                          *)(local_2d8._0_8_ + 0x10))->ptr;
              if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
              goto LAB_0012b6f5;
              uVar24 = uVar24 - uVar25;
            }
            TestEq<int,int>(*(int *)((long)pvVar11 + uVar10 * 4),
                            *(int *)((long)&(plVar26->child->_impl).ptr + (ulong)uVar24 * 4),
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                            ,0x30,
                            "void (anonymous namespace)::test_push_back(uint32_t) [atomic_ref_counting = false, N = 6]"
                           );
            uVar10 = uVar10 + 1;
          } while (uVar10 != 40000);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
          operator_delete(pvVar11,160000);
          piVar12 = (int *)operator_new(160000);
          lVar28 = 0;
          memset(piVar12,0,160000);
          do {
            iVar8 = rand();
            *(int *)((long)piVar12 + lVar28) = iVar8;
            lVar28 = lVar28 + 4;
          } while (lVar28 != 160000);
          immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
          lVar28 = 0;
          do {
            immutable::vector<int,_false,_6>::push_back
                      ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
            local_1f8 = (undefined1  [8])local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2d8._0_8_ = local_2b8;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
            if (*(uint *)local_2d8._0_8_ == 0) goto LAB_0012f7e6;
            if (*(uint32_t *)(local_2d8._0_8_ + 8) == *(uint *)local_2d8._0_8_) {
              plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                          *)(local_2d8._0_8_ + 0x10))->ptr;
              if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
              goto LAB_0012b6f5;
              uVar10 = 0;
            }
            else {
              uVar24 = *(uint32_t *)(local_2d8._0_8_ + 4);
              plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                        ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                          *)(local_2d8._0_8_ + 0x18))->ptr;
              uVar25 = 0;
              if (uVar24 != 0) {
                do {
                  uVar32 = uVar25 >> ((byte)uVar24 & 0x1f);
                  if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                    puVar37 = (undefined8 *)((ulong)((uVar32 & 0x3f) << 3) + *(long *)(plVar26 + 1))
                    ;
                  }
                  else {
                    prVar1 = (plVar26->child->_impl).ptr;
                    do {
                      uVar33 = uVar32;
                      uVar32 = uVar33 + 1;
                    } while ((&prVar1->cnt)[uVar33] <= uVar25);
                    if (uVar33 + 1 != 1) {
                      uVar25 = uVar25 - (&prVar1->cnt)[uVar33 - 1];
                    }
                    puVar37 = (undefined8 *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
                  }
                  plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*puVar37;
                  uVar24 = uVar24 - 6;
                } while (uVar24 != 0);
                uVar25 = uVar25 & 0x3f;
              }
              uVar10 = (ulong)(uVar25 << 2);
            }
            TestEq<int,int>(*piVar12,*(int *)((long)&(plVar26->child->_impl).ptr + uVar10),
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                            ,0x3f,
                            "void (anonymous namespace)::test_front(uint32_t) [atomic_ref_counting = false, N = 6]"
                           );
            lVar28 = lVar28 + 4;
          } while (lVar28 != 160000);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
          operator_delete(piVar12,160000);
          pvVar11 = operator_new(160000);
          lVar28 = 0;
          memset(pvVar11,0,160000);
          do {
            iVar8 = rand();
            *(int *)((long)pvVar11 + lVar28) = iVar8;
            lVar28 = lVar28 + 4;
          } while (lVar28 != 160000);
          immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
          lVar28 = 0;
          do {
            immutable::vector<int,_false,_6>::push_back
                      ((vector<int,_false,_6> *)local_2b8,
                       (value_type_conflict)(vector<int,_false,_6> *)local_2d8);
            local_1f8 = (undefined1  [8])local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2d8._0_8_ = local_2b8;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
            piVar13 = immutable::vector<int,_false,_6>::back((vector<int,_false,_6> *)local_2d8);
            TestEq<int,int>(*(int *)((long)pvVar11 + lVar28),*piVar13,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                            ,0x4f,
                            "void (anonymous namespace)::test_back(uint32_t) [atomic_ref_counting = false, N = 6]"
                           );
            lVar28 = lVar28 + 4;
          } while (lVar28 != 160000);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
          operator_delete(pvVar11,160000);
          immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
          for (uVar24 = 1; uVar24 != 0x9c41; uVar24 = uVar24 + 1) {
            immutable::vector<int,_false,_6>::push_back
                      ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
            local_1f8 = (undefined1  [8])local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2d8._0_8_ = local_2b8;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
            TestEq<unsigned_int,unsigned_int>
                      (uVar24,*(uint *)local_2d8._0_8_,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                       ,0x5a,
                       "void (anonymous namespace)::test_size(uint32_t) [atomic_ref_counting = false, N = 6]"
                      );
          }
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
          pvVar11 = operator_new(160000);
          lVar28 = 0;
          memset(pvVar11,0,160000);
          do {
            iVar8 = rand();
            *(int *)((long)pvVar11 + lVar28) = iVar8;
            lVar28 = lVar28 + 4;
          } while (lVar28 != 160000);
          immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
          lVar28 = 0;
          do {
            immutable::vector<int,_false,_6>::push_back
                      ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
            local_1f8 = (undefined1  [8])local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2d8._0_8_ = local_2b8;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
            if (lVar28 != 0) {
              immutable::vector<int,_false,_6>::pop_back((vector<int,_false,_6> *)local_1f8);
              piVar13 = immutable::vector<int,_false,_6>::back((vector<int,_false,_6> *)local_1f8);
              TestEq<int,int>(*piVar13,*(int *)((long)pvVar11 + lVar28 * 4 + -4),
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                              ,0x6e,
                              "void (anonymous namespace)::test_pop_back(uint32_t) [atomic_ref_counting = false, N = 6]"
                             );
              immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                        ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            }
            lVar28 = lVar28 + 1;
          } while (lVar28 != 40000);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
          operator_delete(pvVar11,160000);
          pvVar11 = operator_new(1600000);
          lVar28 = 0;
          memset(pvVar11,0,1600000);
          do {
            iVar8 = rand();
            *(int *)((long)pvVar11 + lVar28) = iVar8;
            lVar28 = lVar28 + 4;
          } while (lVar28 != 1600000);
          immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
          lVar28 = 0;
          do {
            immutable::vector<int,_false,_6>::push_back
                      ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
            local_1f8 = (undefined1  [8])local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2d8._0_8_ = local_2b8;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 400000);
          pvVar14 = operator_new(0x82364);
          memset(pvVar14,0,0x82364);
          local_268 = pvVar14;
          pvVar15 = operator_new(0x82364);
          lVar28 = 0;
          memset(pvVar15,0,0x82364);
          do {
            iVar8 = rand();
            *(int *)((long)pvVar14 + lVar28 * 4) = iVar8;
            uVar24 = rand();
            *(uint *)((long)pvVar15 + lVar28 * 4) = uVar24 % 400000;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x208d9);
          lVar28 = 0;
          local_258 = pvVar15;
          do {
            uVar24 = *(uint *)((long)local_258 + lVar28 * 4);
            uVar10 = (ulong)uVar24;
            local_2b8 = (undefined1  [8])local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            immutable::vector<int,_false,_6>::set
                      ((vector<int,_false,_6> *)local_288,(size_type_conflict)local_2d8,uVar24);
            local_1f8 = (undefined1  [8])local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2d8._0_8_ = local_288._0_8_;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 ==
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
            if (*(uint *)local_2b8 <= uVar24) goto LAB_0012f7e6;
            uVar32 = *(uint *)local_2b8 - *(uint32_t *)((long)local_2b8 + 8);
            uVar25 = uVar24 - uVar32;
            if (uVar24 < uVar32) {
              plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                        ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                          *)((long)local_2b8 + 0x18))->ptr;
              uVar25 = uVar24;
              for (uVar32 = *(uint32_t *)((long)local_2b8 + 4); uVar32 != 0; uVar32 = uVar32 - 6) {
                uVar33 = uVar25 >> ((byte)uVar32 & 0x1f);
                if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                  plVar38 = (long *)((ulong)((uVar33 & 0x3f) << 3) + *(long *)(plVar26 + 1));
                }
                else {
                  prVar1 = (plVar26->child->_impl).ptr;
                  do {
                    uVar34 = uVar33;
                    uVar33 = uVar34 + 1;
                  } while ((&prVar1->cnt)[uVar34] <= uVar25);
                  if (uVar34 + 1 != 1) {
                    uVar25 = uVar25 - (&prVar1->cnt)[uVar34 - 1];
                  }
                  plVar38 = (long *)((ulong)uVar34 * 8 + *(long *)(plVar26 + 1));
                }
                plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38;
              }
              uVar25 = uVar25 & 0x3f;
            }
            else {
              plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                          *)((long)local_2b8 + 0x10))->ptr;
              if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
              goto LAB_0012b6f5;
            }
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
            if (*(uint *)local_2d8._0_8_ <= uVar24) goto LAB_0012f7e6;
            uVar33 = *(uint *)local_2d8._0_8_ - *(uint32_t *)(local_2d8._0_8_ + 8);
            uVar32 = uVar24 - uVar33;
            if (uVar24 < uVar33) {
              plVar27 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                        ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                          *)(local_2d8._0_8_ + 0x18))->ptr;
              for (uVar32 = *(uint32_t *)(local_2d8._0_8_ + 4); uVar32 != 0; uVar32 = uVar32 - 6) {
                uVar33 = uVar24 >> ((byte)uVar32 & 0x1f);
                if (plVar27->child == (vector<char,_false,_6> *)0x0) {
                  plVar38 = (long *)((ulong)((uVar33 & 0x3f) << 3) + *(long *)(plVar27 + 1));
                }
                else {
                  prVar1 = (plVar27->child->_impl).ptr;
                  do {
                    uVar34 = uVar33;
                    uVar33 = uVar34 + 1;
                  } while ((&prVar1->cnt)[uVar34] <= uVar24);
                  if (uVar34 + 1 != 1) {
                    uVar24 = uVar24 - (&prVar1->cnt)[uVar34 - 1];
                  }
                  plVar38 = (long *)((ulong)uVar34 * 8 + *(long *)(plVar27 + 1));
                }
                plVar27 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38;
              }
              uVar32 = uVar24 & 0x3f;
            }
            else {
              plVar27 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                          *)(local_2d8._0_8_ + 0x10))->ptr;
              if (plVar27 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
              goto LAB_0012b6f5;
            }
            iVar8 = *(int *)((long)&(plVar27->child->_impl).ptr + (ulong)uVar32 * 4);
            TestEq<int,int>(*(int *)((long)&(plVar26->child->_impl).ptr + (ulong)uVar25 * 4),
                            *(int *)((long)pvVar11 + uVar10 * 4),
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                            ,0x8f,
                            "void (anonymous namespace)::test_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                           );
            TestEq<int,int>(iVar8,*(int *)((long)local_268 + lVar28 * 4),
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                            ,0x90,
                            "void (anonymous namespace)::test_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                           );
            *(int *)((long)pvVar11 + uVar10 * 4) = iVar8;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
            pvVar14 = local_268;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0x208d9);
          operator_delete(local_258,0x82364);
          operator_delete(pvVar14,0x82364);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
          operator_delete(pvVar11,1600000);
          pvVar11 = operator_new(40000);
          lVar28 = 0;
          memset(pvVar11,0,40000);
          do {
            iVar8 = rand();
            *(int *)((long)pvVar11 + lVar28) = iVar8;
            lVar28 = lVar28 + 4;
          } while (lVar28 != 40000);
          immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
          lVar28 = 0;
          do {
            immutable::vector<int,_false,_6>::push_back
                      ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
            local_1f8 = (undefined1  [8])local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2d8._0_8_ = local_2b8;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 10000);
          memmove((void *)((long)pvVar11 + 20000),(void *)((long)pvVar11 + 0x4e24),0x4e1c);
          immutable::vector<int,_false,_6>::erase
                    ((vector<int,_false,_6> *)local_2b8,(size_type_conflict)local_2d8);
          local_1f8 = (undefined1  [8])local_2d8._0_8_;
          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
            (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>).
            _M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                   super___atomic_base<unsigned_int>)._M_i + 1;
          }
          local_2d8._0_8_ = local_2b8;
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
            TestEq<unsigned_int,unsigned_long>
                      (*(uint *)local_2d8._0_8_,9999,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                       ,200,
                       "void (anonymous namespace)::test_erase_single(uint32_t) [atomic_ref_counting = false, N = 6]"
                      );
            uVar10 = 0;
            do {
              if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                  (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
              if (*(uint *)local_2d8._0_8_ <= uVar10) goto LAB_0012f7e6;
              uVar25 = *(uint *)local_2d8._0_8_ - *(uint32_t *)(local_2d8._0_8_ + 8);
              uVar24 = (uint)uVar10;
              if (uVar10 < uVar25) {
                plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                          ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                            *)(local_2d8._0_8_ + 0x18))->ptr;
                uVar41 = uVar10 & 0xffffffff;
                for (uVar25 = *(uint32_t *)(local_2d8._0_8_ + 4); uVar25 != 0; uVar25 = uVar25 - 6)
                {
                  uVar32 = (uint)uVar41;
                  uVar24 = uVar32 >> ((byte)uVar25 & 0x1f);
                  if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                    plVar38 = (long *)((ulong)((uVar24 & 0x3f) << 3) + *(long *)(plVar26 + 1));
                  }
                  else {
                    prVar1 = (plVar26->child->_impl).ptr;
                    do {
                      uVar33 = uVar24;
                      uVar24 = uVar33 + 1;
                    } while ((&prVar1->cnt)[uVar33] <= uVar32);
                    if (uVar33 + 1 != 1) {
                      uVar41 = (ulong)(uVar32 - (&prVar1->cnt)[uVar33 - 1]);
                    }
                    plVar38 = (long *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
                  }
                  uVar24 = (uint)uVar41;
                  plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38;
                }
                uVar24 = uVar24 & 0x3f;
              }
              else {
                plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                            *)(local_2d8._0_8_ + 0x10))->ptr;
                if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                goto LAB_0012b6f5;
                uVar24 = uVar24 - uVar25;
              }
              TestEq<int,int>(*(int *)((long)pvVar11 + uVar10 * 4),
                              *(int *)((long)&(plVar26->child->_impl).ptr + (ulong)uVar24 * 4),
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                              ,0xcb,
                              "void (anonymous namespace)::test_erase_single(uint32_t) [atomic_ref_counting = false, N = 6]"
                             );
              uVar10 = uVar10 + 1;
            } while (uVar10 != 9999);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
            operator_delete(pvVar11,40000);
            test_erase<false,6>(200,0x32);
            local_1f8 = (undefined1  [8])0x0;
            pvStack_1f0 = (pointer)0x0;
            local_1e8.super__Tuple_impl<2UL,_unsigned_int>.
            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                 (_Head_base<2UL,_unsigned_int,_false>)0x0;
            local_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
            _Var16 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)operator_new(40000);
            lVar28 = 0;
            local_1f8 = (undefined1  [8])_Var16;
            pvStack_1f0 = (pointer)_Var16;
            local_1e8 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)((long)_Var16 + 40000);
            memset((void *)_Var16,0,40000);
            pvStack_1f0 = (pointer)((long)_Var16 + 40000);
            do {
              iVar8 = rand();
              *(int *)((long)_Var16 + lVar28) = iVar8;
              lVar28 = lVar28 + 4;
            } while (lVar28 != 40000);
            immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
            lVar28 = 0;
            do {
              immutable::vector<int,_false,_6>::push_back
                        ((vector<int,_false,_6> *)local_288,(value_type_conflict)local_2b8);
              local_2d8._0_8_ = local_2b8;
              if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                  (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                super___atomic_base<unsigned_int>)._M_i =
                     (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                     super___atomic_base<unsigned_int>)._M_i + 1;
              }
              local_2b8 = (undefined1  [8])local_288._0_8_;
              immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                        ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
              immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                        ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
              lVar28 = lVar28 + 1;
            } while (lVar28 != 10000);
            local_2d8._0_4_ = 0x29a;
            std::vector<int,_std::allocator<int>_>::_M_insert_rval
                      ((vector<int,_std::allocator<int>_> *)local_1f8,
                       (int *)((long)local_1f8 + 20000),(value_type_conflict *)local_2d8);
            immutable::vector<int,_false,_6>::insert
                      ((vector<int,_false,_6> *)local_288,(size_type_conflict)local_2b8,5000);
            local_2d8._0_8_ = local_2b8;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2b8 = (undefined1  [8])local_288._0_8_;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              TestEq<unsigned_int,unsigned_long>
                        (*(uint *)local_2b8,(long)pvStack_1f0 - (long)local_1f8 >> 2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                         ,0x106,
                         "void (anonymous namespace)::test_insert_single(uint32_t) [atomic_ref_counting = false, N = 6]"
                        );
              uVar10 = 0;
              do {
                if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 ==
                    (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                if (*(uint *)local_2b8 <= uVar10) goto LAB_0012f7e6;
                uVar25 = *(uint *)local_2b8 - *(uint32_t *)((long)local_2b8 + 8);
                uVar24 = (uint)uVar10;
                if (uVar10 < uVar25) {
                  plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                            ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                              *)((long)local_2b8 + 0x18))->ptr;
                  uVar41 = uVar10 & 0xffffffff;
                  for (uVar25 = *(uint32_t *)((long)local_2b8 + 4); uVar25 != 0; uVar25 = uVar25 - 6
                      ) {
                    uVar32 = (uint)uVar41;
                    uVar24 = uVar32 >> ((byte)uVar25 & 0x1f);
                    if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                      plVar38 = (long *)((ulong)((uVar24 & 0x3f) << 3) + *(long *)(plVar26 + 1));
                    }
                    else {
                      prVar1 = (plVar26->child->_impl).ptr;
                      do {
                        uVar33 = uVar24;
                        uVar24 = uVar33 + 1;
                      } while ((&prVar1->cnt)[uVar33] <= uVar32);
                      if (uVar33 + 1 != 1) {
                        uVar41 = (ulong)(uVar32 - (&prVar1->cnt)[uVar33 - 1]);
                      }
                      plVar38 = (long *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
                    }
                    uVar24 = (uint)uVar41;
                    plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38;
                  }
                  uVar24 = uVar24 & 0x3f;
                }
                else {
                  plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                              *)((long)local_2b8 + 0x10))->ptr;
                  if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                  goto LAB_0012b6f5;
                  uVar24 = uVar24 - uVar25;
                }
                TestEq<int,int>(*(uint *)((long)local_1f8 + uVar10 * 4),
                                *(int *)((long)&(plVar26->child->_impl).ptr + (ulong)uVar24 * 4),
                                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                ,0x109,
                                "void (anonymous namespace)::test_insert_single(uint32_t) [atomic_ref_counting = false, N = 6]"
                               );
                uVar10 = uVar10 + 1;
              } while (uVar10 != 0x2711);
              immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                        ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
              if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8 !=
                  (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
              }
              test_concat<false,6>(200);
              pvVar11 = operator_new(40000);
              lVar28 = 0;
              memset(pvVar11,0,40000);
              do {
                iVar8 = rand();
                *(int *)((long)pvVar11 + lVar28) = iVar8;
                lVar28 = lVar28 + 4;
              } while (lVar28 != 40000);
              immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
              lVar28 = 0;
              do {
                immutable::vector<int,_false,_6>::push_back
                          ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
                local_1f8 = (undefined1  [8])local_2d8._0_8_;
                if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                    (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                  (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                  super___atomic_base<unsigned_int>)._M_i =
                       (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
                }
                local_2d8._0_8_ = local_2b8;
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                lVar28 = lVar28 + 1;
              } while (lVar28 != 10000);
              immutable::vector<int,_false,_6>::drop
                        ((vector<int,_false,_6> *)local_2b8,(size_type_conflict)local_2d8);
              local_1f8 = (undefined1  [8])local_2d8._0_8_;
              if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                  (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                super___atomic_base<unsigned_int>)._M_i =
                     (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                     super___atomic_base<unsigned_int>)._M_i + 1;
              }
              local_2d8._0_8_ = local_2b8;
              immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                        ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
              immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                        ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
              uVar10 = 0;
              do {
                if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                    (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                if (*(uint *)local_2d8._0_8_ <= uVar10) goto LAB_0012f7e6;
                uVar25 = *(uint *)local_2d8._0_8_ - *(uint32_t *)(local_2d8._0_8_ + 8);
                uVar24 = (uint)uVar10;
                if (uVar10 < uVar25) {
                  plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                            ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                              *)(local_2d8._0_8_ + 0x18))->ptr;
                  uVar41 = uVar10 & 0xffffffff;
                  for (uVar25 = *(uint32_t *)(local_2d8._0_8_ + 4); uVar25 != 0; uVar25 = uVar25 - 6
                      ) {
                    uVar32 = (uint)uVar41;
                    uVar24 = uVar32 >> ((byte)uVar25 & 0x1f);
                    if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                      plVar38 = (long *)((ulong)((uVar24 & 0x3f) << 3) + *(long *)(plVar26 + 1));
                    }
                    else {
                      prVar1 = (plVar26->child->_impl).ptr;
                      do {
                        uVar33 = uVar24;
                        uVar24 = uVar33 + 1;
                      } while ((&prVar1->cnt)[uVar33] <= uVar32);
                      if (uVar33 + 1 != 1) {
                        uVar41 = (ulong)(uVar32 - (&prVar1->cnt)[uVar33 - 1]);
                      }
                      plVar38 = (long *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
                    }
                    uVar24 = (uint)uVar41;
                    plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38;
                  }
                  uVar24 = uVar24 & 0x3f;
                }
                else {
                  plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                              *)(local_2d8._0_8_ + 0x10))->ptr;
                  if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                  goto LAB_0012b6f5;
                  uVar24 = uVar24 - uVar25;
                }
                TestEq<int,int>(*(int *)((long)pvVar11 + uVar10 * 4 + 0xc),
                                *(int *)((long)&(plVar26->child->_impl).ptr + (ulong)uVar24 * 4),
                                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                ,0x139,
                                "void (anonymous namespace)::test_drop(uint32_t) [atomic_ref_counting = false, N = 6]"
                               );
                uVar10 = uVar10 + 1;
              } while (uVar10 != 0x270d);
              if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                  (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                TestEq<unsigned_int,unsigned_int>
                          (0x270d,*(uint *)local_2d8._0_8_,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                           ,0x13b,
                           "void (anonymous namespace)::test_drop(uint32_t) [atomic_ref_counting = false, N = 6]"
                          );
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                operator_delete(pvVar11,40000);
                pvVar11 = operator_new(40000);
                lVar28 = 0;
                memset(pvVar11,0,40000);
                do {
                  iVar8 = rand();
                  *(int *)((long)pvVar11 + lVar28) = iVar8;
                  lVar28 = lVar28 + 4;
                } while (lVar28 != 40000);
                immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                lVar28 = 0;
                do {
                  immutable::vector<int,_false,_6>::push_back
                            ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
                  local_1f8 = (undefined1  [8])local_2d8._0_8_;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  local_2d8._0_8_ = local_2b8;
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 10000);
                immutable::vector<int,_false,_6>::take
                          ((vector<int,_false,_6> *)local_2b8,(size_type_conflict)local_2d8);
                local_1f8 = (undefined1  [8])local_2d8._0_8_;
                if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                    (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                  (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                  super___atomic_base<unsigned_int>)._M_i =
                       (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
                }
                local_2d8._0_8_ = local_2b8;
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                uVar10 = 0;
                do {
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                  if (*(uint *)local_2d8._0_8_ <= uVar10) goto LAB_0012f7e6;
                  uVar25 = *(uint *)local_2d8._0_8_ - *(uint32_t *)(local_2d8._0_8_ + 8);
                  uVar24 = (uint)uVar10;
                  if (uVar10 < uVar25) {
                    plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                              ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                *)(local_2d8._0_8_ + 0x18))->ptr;
                    uVar41 = uVar10 & 0xffffffff;
                    for (uVar25 = *(uint32_t *)(local_2d8._0_8_ + 4); uVar25 != 0;
                        uVar25 = uVar25 - 6) {
                      uVar32 = (uint)uVar41;
                      uVar24 = uVar32 >> ((byte)uVar25 & 0x1f);
                      if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                        plVar38 = (long *)((ulong)((uVar24 & 0x3f) << 3) + *(long *)(plVar26 + 1));
                      }
                      else {
                        prVar1 = (plVar26->child->_impl).ptr;
                        do {
                          uVar33 = uVar24;
                          uVar24 = uVar33 + 1;
                        } while ((&prVar1->cnt)[uVar33] <= uVar32);
                        if (uVar33 + 1 != 1) {
                          uVar41 = (ulong)(uVar32 - (&prVar1->cnt)[uVar33 - 1]);
                        }
                        plVar38 = (long *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
                      }
                      uVar24 = (uint)uVar41;
                      plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38;
                    }
                    uVar24 = uVar24 & 0x3f;
                  }
                  else {
                    plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                *)(local_2d8._0_8_ + 0x10))->ptr;
                    if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                    goto LAB_0012b6f5;
                    uVar24 = uVar24 - uVar25;
                  }
                  TestEq<int,int>(*(int *)((long)pvVar11 + uVar10 * 4),
                                  *(int *)((long)&(plVar26->child->_impl).ptr + (ulong)uVar24 * 4),
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                  ,0x14e,
                                  "void (anonymous namespace)::test_take(uint32_t) [atomic_ref_counting = false, N = 6]"
                                 );
                  uVar10 = uVar10 + 1;
                } while (uVar10 != 3);
                if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                    (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                  TestEq<int,unsigned_int>
                            (3,*(uint *)local_2d8._0_8_,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                             ,0x150,
                             "void (anonymous namespace)::test_take(uint32_t) [atomic_ref_counting = false, N = 6]"
                            );
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  operator_delete(pvVar11,40000);
                  piVar12 = (int *)operator_new(40000);
                  lVar28 = 0;
                  memset(piVar12,0,40000);
                  do {
                    iVar8 = rand();
                    *(int *)((long)piVar12 + lVar28) = iVar8;
                    lVar28 = lVar28 + 4;
                  } while (lVar28 != 40000);
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
                  lVar28 = 0;
                  do {
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_2b8);
                    local_1f8 = local_2b8;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2b8 = (undefined1  [8])local_2d8._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != 10000);
                  local_1f8 = local_2b8;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  pvStack_1f0 = (pointer)((ulong)pvStack_1f0 & 0xffffffff00000000);
                  local_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                  local_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                  local_1e0._M_head_impl = (int *)0x0;
                  immutable::vector_iterator<int,_false,_6>::vector_iterator
                            ((vector_iterator<int,_false,_6> *)local_2d8,local_2b8);
                  piVar29 = piVar12;
                  if (pvStack_1f0._0_4_ != local_2d8._8_4_) goto LAB_0012b714;
                  while (local_1f8 != (undefined1  [8])local_2d8._0_8_) {
LAB_0012b714:
                    do {
                      piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                          ((vector_iterator<int,_false,_6> *)local_1f8);
                      TestEq<int,int>(*piVar18,*piVar29,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x168,
                                      "void (anonymous namespace)::test_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                                     );
                      _Var9._M_head_impl = pvStack_1f0._0_4_ + 1;
                      pvStack_1f0 = (pointer)CONCAT44(pvStack_1f0._4_4_,_Var9._M_head_impl);
                      piVar29 = piVar29 + 1;
                    } while (_Var9._M_head_impl != local_2d8._8_4_);
                  }
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                  operator_delete(piVar12,40000);
                  pvVar11 = operator_new(4000);
                  memset(pvVar11,0,4000);
                  pvVar14 = operator_new(4000);
                  memset(pvVar14,0,4000);
                  pvVar15 = operator_new(4000);
                  memset(pvVar15,0,4000);
                  pvVar17 = operator_new(4000);
                  local_58 = (long)pvVar11 + 4000;
                  local_60 = (long)pvVar14 + 4000;
                  lVar28 = 0;
                  memset(pvVar17,0,4000);
                  do {
                    iVar8 = rand();
                    *(int *)((long)pvVar11 + lVar28) = iVar8;
                    lVar28 = lVar28 + 4;
                  } while (lVar28 != 4000);
                  lVar28 = 0;
                  do {
                    iVar8 = rand();
                    *(int *)((long)pvVar14 + lVar28) = iVar8;
                    lVar28 = lVar28 + 4;
                  } while (lVar28 != 4000);
                  lVar28 = 0;
                  do {
                    iVar8 = rand();
                    *(int *)((long)pvVar15 + lVar28) = iVar8;
                    lVar28 = lVar28 + 4;
                  } while (lVar28 != 4000);
                  lVar28 = 0;
                  do {
                    iVar8 = rand();
                    *(int *)((long)pvVar17 + lVar28) = iVar8;
                    lVar28 = lVar28 + 4;
                  } while (lVar28 != 4000);
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_288);
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                  local_210 = pvVar14;
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_2e0);
                  local_268 = pvVar15;
                  local_230 = pvVar11;
                  local_68 = (long)pvVar15 + 4000;
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_290);
                  local_70 = (long)pvVar17 + 4000;
                  lVar28 = 0;
                  local_258 = pvVar17;
                  do {
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_288);
                    local_1f8 = (undefined1  [8])local_288._0_8_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_288._0_8_ = local_2d8._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_250);
                    local_1f8 = (undefined1  [8])local_250._impl;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_250._impl.ptr = (rrb<char,_false,_6> *)local_2d8._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_2e0);
                    _Var16 = local_2e0;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                    local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         local_2d8._4_4_;
                    _Var31 = local_2e0;
                    local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                         _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                         _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._0_4_ =
                         local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._4_4_ =
                         local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_2e0 = _Var31;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_290);
                    _Var16 = local_290;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_290.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                    local_290.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         local_2d8._4_4_;
                    _Var31 = local_290;
                    local_290.super__Tuple_impl<2UL,_unsigned_int> =
                         _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_290.super__Head_base<1UL,_unsigned_int,_false> =
                         _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._0_4_ =
                         local_290.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._4_4_ =
                         local_290.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_290 = _Var31;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    pvVar11 = local_230;
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != 1000);
                  local_2b8._0_4_ = (_Head_base<2UL,_unsigned_int,_false>)0x0;
                  local_2b8._4_4_ = 0;
                  _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)0x0;
                  _Stack_2b0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                  local_2a8.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)0x0;
                  local_2a8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                  std::vector<int,std::allocator<int>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((vector<int,std::allocator<int>> *)local_2b8,0,local_230,local_58);
                  pvVar14 = local_210;
                  std::vector<int,std::allocator<int>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_210,
                             local_60);
                  std::vector<int,std::allocator<int>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_268,
                             local_68);
                  std::vector<int,std::allocator<int>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_258,
                             local_70);
                  immutable::operator+
                            ((immutable *)local_2d8,(vector<int,_false,_6> *)local_288,
                             (vector<int,_false,_6> *)&local_250);
                  immutable::operator+
                            ((immutable *)local_1f8,(vector<int,_false,_6> *)local_2d8,
                             (vector<int,_false,_6> *)&local_2e0);
                  immutable::operator+
                            ((immutable *)&local_260,(vector<int,_false,_6> *)local_1f8,
                             (vector<int,_false,_6> *)&local_290);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  _Var16 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8;
                  local_1f8._0_4_ =
                       local_260.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                  local_1f8._4_4_ =
                       local_260.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  if (local_260 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)((long)local_260 + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)((long)local_260 + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  pvStack_1f0 = (pointer)((ulong)pvStack_1f0 & 0xffffffff00000000);
                  local_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                  local_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                  local_1e0._M_head_impl = (int *)0x0;
                  immutable::vector_iterator<int,_false,_6>::vector_iterator
                            ((vector_iterator<int,_false,_6> *)local_2d8,&local_260);
                  if ((pvStack_1f0._0_4_ != local_2d8._8_4_) ||
                     (local_1f8 != (undefined1  [8])local_2d8._0_8_)) {
                    do {
                      do {
                        piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                            ((vector_iterator<int,_false,_6> *)local_1f8);
                        TestEq<int,int>(*piVar18,*(uint *)_Var16,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x192,
                                        "void (anonymous namespace)::test_iterator_2(uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        _Var9._M_head_impl = pvStack_1f0._0_4_ + 1;
                        pvStack_1f0 = (pointer)CONCAT44(pvStack_1f0._4_4_,_Var9._M_head_impl);
                        _Var16 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)((long)_Var16 + 4);
                      } while (_Var9._M_head_impl != local_2d8._8_4_);
                    } while (local_1f8 != (undefined1  [8])local_2d8._0_8_);
                  }
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_260);
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    operator_delete((void *)local_2b8,(long)local_2a8 - (long)local_2b8);
                  }
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_290);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_2e0);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                  operator_delete(local_258,4000);
                  operator_delete(local_268,4000);
                  operator_delete(pvVar14,4000);
                  operator_delete(pvVar11,4000);
                  piVar12 = (int *)operator_new(40000);
                  lVar28 = 0;
                  memset(piVar12,0,40000);
                  do {
                    iVar8 = rand();
                    *(int *)((long)piVar12 + lVar28) = iVar8;
                    lVar28 = lVar28 + 4;
                  } while (lVar28 != 40000);
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
                  lVar28 = 0;
                  do {
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_2b8);
                    local_1f8 = local_2b8;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2b8 = (undefined1  [8])local_2d8._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != 10000);
                  memmove(piVar12 + 0x9c4,piVar12 + 5000,20000);
                  immutable::vector<int,_false,_6>::erase
                            ((vector<int,_false,_6> *)local_2d8,(size_type_conflict)local_2b8,0x9c4)
                  ;
                  local_1f8 = local_2b8;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  local_2b8 = (undefined1  [8])local_2d8._0_8_;
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  local_1f8 = local_2b8;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  pvStack_1f0 = (pointer)((ulong)pvStack_1f0 & 0xffffffff00000000);
                  local_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                  local_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                  local_1e0._M_head_impl = (int *)0x0;
                  immutable::vector_iterator<int,_false,_6>::vector_iterator
                            ((vector_iterator<int,_false,_6> *)local_2d8,local_2b8);
                  if ((pvStack_1f0._0_4_ != local_2d8._8_4_) ||
                     (local_1f8 != (undefined1  [8])local_2d8._0_8_)) {
                    piVar29 = piVar12;
                    do {
                      do {
                        piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                            ((vector_iterator<int,_false,_6> *)local_1f8);
                        TestEq<int,int>(*piVar18,*piVar29,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x1ae,
                                        "void (anonymous namespace)::test_iterator_3(uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        _Var9._M_head_impl = pvStack_1f0._0_4_ + 1;
                        pvStack_1f0 = (pointer)CONCAT44(pvStack_1f0._4_4_,_Var9._M_head_impl);
                        piVar29 = piVar29 + 1;
                      } while (_Var9._M_head_impl != local_2d8._8_4_);
                    } while (local_1f8 != (undefined1  [8])local_2d8._0_8_);
                  }
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                  operator_delete(piVar12,40000);
                  pvVar11 = operator_new(40000);
                  lVar28 = 0;
                  memset(pvVar11,0,40000);
                  do {
                    iVar8 = rand();
                    *(int *)((long)pvVar11 + lVar28) = iVar8;
                    lVar28 = lVar28 + 4;
                  } while (lVar28 != 40000);
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                  lVar28 = 0;
                  do {
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_250);
                    local_1f8 = (undefined1  [8])local_250._impl;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_250._impl.ptr = (rrb<char,_false,_6> *)local_2d8._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != 10000);
                  immutable::vector<int,_false,_6>::rbegin
                            ((reverse_iterator *)local_2b8,(vector<int,_false,_6> *)&local_250);
                  immutable::vector<int,_false,_6>::rend
                            ((reverse_iterator *)local_288,(vector<int,_false,_6> *)&local_250);
                  piVar12 = (int *)((long)pvVar11 + 0x9c3c);
                  while( true ) {
                    uVar5 = local_288._8_4_;
                    uVar3 = local_288._0_8_;
                    auVar4 = local_2b8;
                    local_1f8 = local_2b8;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_1e0._M_head_impl = local_2a0._M_head_impl;
                    pvStack_1f0 = (pointer)_Stack_2b0;
                    pvVar6 = pvStack_1f0;
                    local_1e8 = local_2a8;
                    local_2d8._0_8_ = local_288._0_8_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2c0._M_head_impl = local_270._M_head_impl;
                    local_2d8._12_4_ = local_288._12_4_;
                    local_2d8._8_4_ = local_288._8_4_;
                    _Stack_2c8 = _Stack_278;
                    pvStack_1f0._0_4_ =
                         (uint)_Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    _Var9._M_head_impl = pvStack_1f0._0_4_;
                    pvStack_1f0 = pvVar6;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    if ((auVar4 == (undefined1  [8])uVar3) && (_Var9._M_head_impl == uVar5)) break;
                    piVar19 = std::reverse_iterator<immutable::vector_iterator<int,_false,_6>_>::
                              operator*((reverse_iterator<immutable::vector_iterator<int,_false,_6>_>
                                         *)local_2b8);
                    TestEq<int,int>(*piVar19,*piVar12,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                    ,0x1c7,
                                    "void (anonymous namespace)::test_reverse_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                                   );
                    _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)
                         ((int)_Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + -1);
                    piVar12 = piVar12 + -1;
                  }
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                  operator_delete(pvVar11,40000);
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                  local_2b8 = (undefined1  [8])local_2d8._0_8_;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  bVar7 = immutable::vector<int,_false,_6>::operator==
                                    ((vector<int,_false,_6> *)local_2d8,
                                     (vector<int,_false,_6> *)local_2b8);
                  TestEq<bool,bool>(true,bVar7,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                    ,0x1d0,
                                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                   );
                  immutable::vector<int,_false,_6>::push_back
                            ((vector<int,_false,_6> *)local_288,(value_type_conflict)local_2d8);
                  immutable::vector<int,_false,_6>::push_back
                            ((vector<int,_false,_6> *)&local_250,(value_type_conflict)local_2d8);
                  bVar7 = immutable::vector<int,_false,_6>::operator==
                                    ((vector<int,_false,_6> *)local_288,
                                     (vector<int,_false,_6> *)&local_250);
                  TestEq<bool,bool>(true,bVar7,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                    ,0x1d3,
                                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                   );
                  local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)
                       (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                  local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                       local_288._4_4_;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  bVar7 = immutable::vector<int,_false,_6>::operator==
                                    ((vector<int,_false,_6> *)&local_2e0,
                                     (vector<int,_false,_6> *)local_288);
                  TestEq<bool,bool>(true,bVar7,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                    ,0x1d5,
                                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                   );
                  bVar7 = immutable::vector<int,_false,_6>::operator==
                                    ((vector<int,_false,_6> *)&local_2e0,
                                     (vector<int,_false,_6> *)&local_250);
                  TestEq<bool,bool>(true,bVar7,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                    ,0x1d6,
                                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                   );
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_290);
                  bVar7 = immutable::vector<int,_false,_6>::operator==
                                    ((vector<int,_false,_6> *)local_2d8,
                                     (vector<int,_false,_6> *)&local_290);
                  TestEq<bool,bool>(true,bVar7,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                    ,0x1d8,
                                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                   );
                  immutable::vector<int,_false,_6>::push_back
                            ((vector<int,_false,_6> *)&local_260,(value_type_conflict)local_2d8);
                  _Var16 = local_290;
                  if (local_260 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)((long)local_260 + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)((long)local_260 + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  local_290 = local_260;
                  _Var31 = local_290;
                  local_290.super__Tuple_impl<2UL,_unsigned_int> =
                       _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                  local_290.super__Head_base<1UL,_unsigned_int,_false> =
                       _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  local_1f8._0_4_ =
                       local_290.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                  local_1f8._4_4_ =
                       local_290.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  local_290 = _Var31;
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_260);
                  bVar7 = immutable::vector<int,_false,_6>::operator==
                                    ((vector<int,_false,_6> *)local_2d8,
                                     (vector<int,_false,_6> *)&local_290);
                  TestEq<bool,bool>(true,!bVar7,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                    ,0x1da,
                                    "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                   );
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_290);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_2e0);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  lVar28 = 0;
                  local_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)0x0;
                  local_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                  local_1f8 = (undefined1  [8])0x0;
                  pvStack_1f0 = (pointer)0x0;
                  _Var16 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)operator_new(0x28);
                  pvStack_1f0 = (pointer)((long)_Var16 + 0x28);
                  *(undefined8 *)_Var16 = 0;
                  *(undefined8 *)((long)_Var16 + 8) = 0;
                  ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                    *)((long)_Var16 + 0x10))->ptr =
                       (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0;
                  ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                    *)((long)_Var16 + 0x18))->ptr =
                       (tree_node<immutable::vector<char,_false,_6>,_true> *)0x0;
                  *(undefined8 *)((long)_Var16 + 0x20) = 0;
                  local_1f8 = (undefined1  [8])_Var16;
                  local_1e8 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)pvStack_1f0;
                  do {
                    iVar8 = rand();
                    *(int *)((long)_Var16 + lVar28) = iVar8;
                    lVar28 = lVar28 + 4;
                  } while (lVar28 != 0x28);
                  puVar37 = (undefined8 *)operator_new(0x28);
                  puVar37[2] = 0;
                  puVar37[3] = 0;
                  *puVar37 = 0;
                  puVar37[1] = 0;
                  puVar37[4] = 0;
                  lVar28 = 0;
                  do {
                    iVar8 = rand();
                    *(int *)((long)puVar37 + lVar28) = iVar8;
                    lVar28 = lVar28 + 4;
                  } while (lVar28 != 0x28);
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
                  lVar28 = 0;
                  do {
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)local_288,(value_type_conflict)local_2b8);
                    local_2d8._0_8_ = local_2b8;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2b8 = (undefined1  [8])local_288._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != 10);
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_288);
                  lVar28 = 0;
                  do {
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)&local_250,(value_type_conflict)local_288);
                    local_2d8._0_8_ = local_288._0_8_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_250._impl.ptr !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_288._0_8_ = local_250._impl.ptr;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != 10);
                  std::vector<int,std::allocator<int>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((vector<int,std::allocator<int>> *)local_1f8,
                             (uint *)((long)local_1f8 + 0x14),puVar37,puVar37 + 5);
                  local_250._impl.ptr = (rrb<char,_false,_6> *)local_288._0_8_;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  immutable::vector<int,_false,_6>::insert
                            ((vector<int,_false,_6> *)local_2d8,(size_type_conflict)local_2b8,
                             (vector<int,_false,_6> *)0x5);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    TestEq<unsigned_int,unsigned_long>
                              (*(uint *)local_2d8._0_8_,(long)pvStack_1f0 - (long)local_1f8 >> 2,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                               ,0x1f7,
                               "void (anonymous namespace)::test_insert_vector(uint32_t) [atomic_ref_counting = false, N = 6]"
                              );
                    if ((undefined1  [8])pvStack_1f0 != local_1f8) {
                      uVar10 = 0;
                      do {
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                        uVar24 = (uint)uVar10;
                        if (*(uint *)local_2d8._0_8_ <= uVar24) goto LAB_0012f7e6;
                        uVar32 = *(uint *)local_2d8._0_8_ - *(uint32_t *)(local_2d8._0_8_ + 8);
                        uVar25 = uVar24 - uVar32;
                        if (uVar24 < uVar32) {
                          plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                    ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)(local_2d8._0_8_ + 0x18))->ptr;
                          uVar25 = uVar24;
                          uVar41 = uVar10;
                          for (uVar32 = *(uint32_t *)(local_2d8._0_8_ + 4); uVar32 != 0;
                              uVar32 = uVar32 - 6) {
                            uVar33 = (uint)uVar41;
                            uVar25 = uVar33 >> ((byte)uVar32 & 0x1f);
                            if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                              plVar38 = (long *)((ulong)((uVar25 & 0x3f) << 3) +
                                                *(long *)(plVar26 + 1));
                            }
                            else {
                              prVar1 = (plVar26->child->_impl).ptr;
                              do {
                                uVar34 = uVar25;
                                uVar25 = uVar34 + 1;
                              } while ((&prVar1->cnt)[uVar34] <= uVar33);
                              if (uVar34 + 1 != 1) {
                                uVar41 = (ulong)(uVar33 - (&prVar1->cnt)[uVar34 - 1]);
                              }
                              plVar38 = (long *)((ulong)uVar34 * 8 + *(long *)(plVar26 + 1));
                            }
                            uVar25 = (uint)uVar41;
                            plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38
                            ;
                          }
                          uVar25 = uVar25 & 0x3f;
                        }
                        else {
                          plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)(local_2d8._0_8_ + 0x10))->ptr;
                          if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                          goto LAB_0012b6f5;
                        }
                        TestEq<int,int>(*(int *)((long)&(plVar26->child->_impl).ptr +
                                                (ulong)uVar25 * 4),
                                        *(uint *)((long)local_1f8 + uVar10 * 4),
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x1fa,
                                        "void (anonymous namespace)::test_insert_vector(uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        uVar10 = (ulong)(uVar24 + 1);
                      } while (uVar10 < (ulong)((long)pvStack_1f0 - (long)local_1f8 >> 2));
                    }
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                    operator_delete(puVar37,0x28);
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8 !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
                    }
                    pvVar11 = operator_new(52000);
                    lVar28 = 0;
                    memset(pvVar11,0,52000);
                    do {
                      iVar8 = rand();
                      *(int *)((long)pvVar11 + lVar28) = iVar8;
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 52000);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                    immutable::transient_vector<int,_false,_6>::transient_vector
                              ((transient_vector<int,_false,_6> *)local_2b8,
                               (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    lVar30 = 1;
                    lVar28 = 0;
                    do {
                      local_268 = (void *)lVar28;
                      immutable::transient_rrb_push<int,false,6>
                                ((immutable *)local_1f8,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,
                                 *(int *)((long)pvVar11 + lVar28 * 4));
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                      lVar28 = 0;
                      do {
                        piVar12 = immutable::transient_rrb_nth<int,false,6>
                                            ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                             local_2b8,(uint32_t)lVar28);
                        TestEq<int,int>(*(int *)((long)pvVar11 + lVar28 * 4),*piVar12,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x20f,
                                        "void (anonymous namespace)::test_transient_vector_push(uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        lVar28 = lVar28 + 1;
                      } while (lVar30 != lVar28);
                      lVar28 = (long)local_268 + 1;
                      lVar30 = lVar30 + 1;
                    } while (lVar28 != 13000);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    operator_delete(pvVar11,52000);
                    pvVar11 = operator_new(1600000);
                    lVar28 = 0;
                    memset(pvVar11,0,1600000);
                    do {
                      iVar8 = rand();
                      *(int *)((long)pvVar11 + lVar28) = iVar8;
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 1600000);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                    immutable::transient_vector<int,_false,_6>::transient_vector
                              ((transient_vector<int,_false,_6> *)local_2b8,
                               (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    lVar28 = 0;
                    do {
                      immutable::transient_rrb_push<int,false,6>
                                ((immutable *)local_1f8,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,
                                 *(int *)((long)pvVar11 + lVar28 * 4));
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 400000);
                    immutable::vector<int,_false,_6>::vector
                              ((vector<int,_false,_6> *)local_288,
                               (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                    local_1f8 = (undefined1  [8])local_2d8._0_8_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2d8._0_8_ = local_288._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                    immutable::transient_vector<int,_false,_6>::transient_vector
                              ((transient_vector<int,_false,_6> *)local_288,
                               (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    local_1f8 = local_2b8;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2b8 = (undefined1  [8])local_288._0_8_;
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_288);
                    lVar28 = 399999;
                    do {
                      piVar20 = immutable::transient_vector<int,_false,_6>::back
                                          ((transient_vector<int,_false,_6> *)local_2b8);
                      TestEq<int,int>(*(int *)((long)pvVar11 + lVar28 * 4),*piVar20,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x228,
                                      "void (anonymous namespace)::test_transient_vector_pop(uint32_t) [atomic_ref_counting = false, N = 6]"
                                     );
                      immutable::transient_rrb_pop<int,false,6>
                                ((immutable *)local_1f8,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                      bVar7 = lVar28 != 0;
                      lVar28 = lVar28 + -1;
                    } while (bVar7);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    operator_delete(pvVar11,1600000);
                    pvVar11 = operator_new(1600000);
                    lVar28 = 0;
                    memset(pvVar11,0,1600000);
                    do {
                      iVar8 = rand();
                      *(int *)((long)pvVar11 + lVar28) = iVar8;
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 1600000);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                    immutable::transient_vector<int,_false,_6>::transient_vector
                              ((transient_vector<int,_false,_6> *)local_2b8,
                               (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    lVar28 = 0;
                    do {
                      immutable::transient_rrb_push<int,false,6>
                                ((immutable *)local_1f8,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,
                                 *(int *)((long)pvVar11 + lVar28 * 4));
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 400000);
                    immutable::vector<int,_false,_6>::vector
                              ((vector<int,_false,_6> *)local_288,
                               (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                    local_1f8 = (undefined1  [8])local_2d8._0_8_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2d8._0_8_ = local_288._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                    pvVar15 = operator_new(0x82364);
                    memset(pvVar15,0,0x82364);
                    pvVar14 = operator_new(0x82364);
                    lVar28 = 0;
                    memset(pvVar14,0,0x82364);
                    do {
                      iVar8 = rand();
                      *(int *)((long)pvVar15 + lVar28 * 4) = iVar8;
                      uVar24 = rand();
                      *(uint *)((long)pvVar14 + lVar28 * 4) = uVar24 % 400000;
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 0x208d9);
                    local_268 = pvVar11;
                    local_258 = pvVar14;
                    immutable::transient_vector<int,_false,_6>::transient_vector
                              ((transient_vector<int,_false,_6> *)local_288,
                               (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    local_1f8 = local_2b8;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2b8 = (undefined1  [8])local_288._0_8_;
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_288);
                    lVar28 = 0;
                    do {
                      uVar24 = *(uint *)((long)pvVar14 + lVar28 * 4);
                      immutable::transient_rrb_update<int,false,6>
                                ((immutable *)local_1f8,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,uVar24,
                                 *(int *)((long)pvVar15 + lVar28 * 4));
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                      if (*(uint *)local_2d8._0_8_ <= uVar24) goto LAB_0012f7e6;
                      uVar32 = *(uint *)local_2d8._0_8_ - *(uint32_t *)(local_2d8._0_8_ + 8);
                      uVar25 = uVar24 - uVar32;
                      if (uVar24 < uVar32) {
                        plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                  ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                    *)(local_2d8._0_8_ + 0x18))->ptr;
                        uVar25 = uVar24;
                        for (uVar32 = *(uint32_t *)(local_2d8._0_8_ + 4); uVar32 != 0;
                            uVar32 = uVar32 - 6) {
                          uVar33 = uVar25 >> ((byte)uVar32 & 0x1f);
                          if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                            plVar38 = (long *)((ulong)((uVar33 & 0x3f) << 3) +
                                              *(long *)(plVar26 + 1));
                          }
                          else {
                            prVar1 = (plVar26->child->_impl).ptr;
                            do {
                              uVar34 = uVar33;
                              uVar33 = uVar34 + 1;
                            } while ((&prVar1->cnt)[uVar34] <= uVar25);
                            if (uVar34 + 1 != 1) {
                              uVar25 = uVar25 - (&prVar1->cnt)[uVar34 - 1];
                            }
                            plVar38 = (long *)((ulong)uVar34 * 8 + *(long *)(plVar26 + 1));
                          }
                          plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38;
                        }
                        uVar25 = uVar25 & 0x3f;
                      }
                      else {
                        plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                    *)(local_2d8._0_8_ + 0x10))->ptr;
                        if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                        goto LAB_0012b6f5;
                      }
                      iVar8 = *(int *)((long)&(plVar26->child->_impl).ptr + (ulong)uVar25 * 4);
                      piVar12 = immutable::transient_rrb_nth<int,false,6>
                                          ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                           local_2b8,uVar24);
                      iVar39 = *piVar12;
                      TestEq<int,int>(iVar8,*(int *)((long)local_268 + (ulong)uVar24 * 4),
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x24e,
                                      "void (anonymous namespace)::test_transient_vector_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                     );
                      TestEq<int,int>(iVar39,*(int *)((long)pvVar15 + lVar28 * 4),
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x24f,
                                      "void (anonymous namespace)::test_transient_vector_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                     );
                      lVar28 = lVar28 + 1;
                      pvVar14 = local_258;
                    } while (lVar28 != 0x208d9);
                    operator_delete(local_258,0x82364);
                    operator_delete(pvVar15,0x82364);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    operator_delete(local_268,1600000);
                    pvVar11 = (void *)0x0;
                    do {
                      local_258 = pvVar11;
                      uVar24 = rand();
                      uVar25 = uVar24 % 0x32 + 0x20;
                      uVar10 = (ulong)uVar25;
                      uVar24 = rand();
                      pvVar11 = (void *)(0x28 % (ulong)uVar24);
                      std::vector<int,_std::allocator<int>_>::vector
                                ((vector<int,_std::allocator<int>_> *)local_1f8,(size_type)pvVar11,
                                 (allocator_type *)local_2d8);
                      std::vector<int,_std::allocator<int>_>::vector
                                ((vector<int,_std::allocator<int>_> *)local_2d8,uVar10,
                                 (allocator_type *)local_2b8);
                      if (pvVar11 != (void *)0x0) {
                        pvVar14 = (void *)0x0;
                        do {
                          iVar8 = rand();
                          *(int *)((long)local_1f8 + (long)pvVar14 * 4) = iVar8 % 0x1000;
                          pvVar14 = (void *)((long)pvVar14 + 1);
                        } while (pvVar14 < pvVar11);
                      }
                      uVar41 = 0;
                      do {
                        iVar8 = rand();
                        *(int *)(local_2d8._0_8_ + uVar41 * 4) = iVar8 % 0x1000;
                        uVar41 = uVar41 + 1;
                      } while (uVar10 != uVar41);
                      uVar24 = rand();
                      local_268 = pvVar11;
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_288);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)&local_2e0,
                                 (ref<immutable::rrb<int,_false,_6>_> *)local_288);
                      iVar8 = (int)((ulong)uVar24 % (ulong)pvVar11);
                      if (iVar8 != 0) {
                        uVar41 = 0;
                        do {
                          immutable::transient_rrb_push<int,false,6>
                                    ((immutable *)local_2b8,
                                     (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0,
                                     *(uint *)((long)local_1f8 + uVar41 * 4));
                          immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                    ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                          uVar41 = uVar41 + 1;
                        } while (uVar41 < (ulong)uVar24 % (ulong)pvVar11);
                      }
                      immutable::vector<int,_false,_6>::vector
                                ((vector<int,_false,_6> *)&local_290,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0);
                      local_2b8 = (undefined1  [8])local_288._0_8_;
                      if (local_290 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_290 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_290 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_288._0_4_ =
                           local_290.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_288._4_4_ =
                           local_290.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_290);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)&local_290,
                                 (ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                      _Var16 = local_2e0;
                      if (local_290 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_290 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_290 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2e0 = local_290;
                      _Var31 = local_2e0;
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_2b8._0_4_ =
                           local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_2b8._4_4_ =
                           local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0 = _Var31;
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_290);
                      iVar39 = (int)local_268;
                      uVar41 = 0;
                      do {
                        immutable::transient_rrb_push<int,false,6>
                                  ((immutable *)local_2b8,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0,
                                   *(uint *)((long)local_1f8 +
                                            (ulong)(uint)(iVar8 + (int)uVar41) * 4));
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                        uVar41 = uVar41 + 1;
                      } while (uVar41 < (uint)(iVar39 - iVar8));
                      immutable::vector<int,_false,_6>::vector
                                ((vector<int,_false,_6> *)&local_290,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0);
                      local_2b8 = (undefined1  [8])local_250._impl;
                      if (local_290 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_290 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_290 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_250._impl.ptr = (rrb<char,_false,_6> *)local_290;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_290);
                      immutable::operator+
                                ((immutable *)&local_290,(vector<int,_false,_6> *)local_288,
                                 (vector<int,_false,_6> *)&local_250);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)&local_260,
                                 (ref<immutable::rrb<int,_false,_6>_> *)&local_290);
                      uVar41 = 0;
                      do {
                        immutable::transient_rrb_push<int,false,6>
                                  ((immutable *)local_2b8,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_260,
                                   *(uint *)(local_2d8._0_8_ + uVar41 * 4));
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                        uVar41 = uVar41 + 1;
                      } while (uVar10 != uVar41);
                      if (local_260 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        __function = 
                        "T *immutable::ref<immutable::transient_rrb<int, false, 6>>::operator->() const [T = immutable::transient_rrb<int, false, 6>]"
                        ;
                        goto LAB_0012b70a;
                      }
                      TestEq<unsigned_int,unsigned_int>
                                (uVar25 + (int)local_268,*(uint *)local_260,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                 ,0x281,
                                 "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                );
                      pvVar11 = (void *)0x0;
                      do {
                        uVar24 = (uint)pvVar11;
                        piVar12 = immutable::transient_rrb_nth<int,false,6>
                                            ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                             &local_260,uVar24);
                        if (local_290 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                        goto LAB_0012f7cc;
                        if ((void *)(ulong)*(uint *)local_290 <= pvVar11) goto LAB_0012f7e6;
                        iVar8 = *piVar12;
                        uVar25 = *(uint *)local_290 - *(uint32_t *)((long)local_290 + 8);
                        if (pvVar11 < (void *)(ulong)uVar25) {
                          plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                    ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)((long)local_290 + 0x18))->ptr;
                          uVar41 = (ulong)pvVar11 & 0xffffffff;
                          for (uVar25 = *(uint32_t *)((long)local_290 + 4); uVar25 != 0;
                              uVar25 = uVar25 - 6) {
                            uVar32 = (uint)uVar41;
                            uVar24 = uVar32 >> ((byte)uVar25 & 0x1f);
                            if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                              plVar38 = (long *)((ulong)((uVar24 & 0x3f) << 3) +
                                                *(long *)(plVar26 + 1));
                            }
                            else {
                              prVar1 = (plVar26->child->_impl).ptr;
                              do {
                                uVar33 = uVar24;
                                uVar24 = uVar33 + 1;
                              } while ((&prVar1->cnt)[uVar33] <= uVar32);
                              if (uVar33 + 1 != 1) {
                                uVar41 = (ulong)(uVar32 - (&prVar1->cnt)[uVar33 - 1]);
                              }
                              plVar38 = (long *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
                            }
                            uVar24 = (uint)uVar41;
                            plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38
                            ;
                          }
                          uVar24 = uVar24 & 0x3f;
                        }
                        else {
                          plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)((long)local_290 + 0x10))->ptr;
                          if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                          goto LAB_0012b6f5;
                          uVar24 = uVar24 - uVar25;
                        }
                        iVar39 = *(int *)((long)&(plVar26->child->_impl).ptr + (ulong)uVar24 * 4);
                        TestEq<int,int>(*(uint *)((long)local_1f8 + (long)pvVar11 * 4),iVar8,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x288,
                                        "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        TestEq<int,int>(iVar39,iVar8,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x289,
                                        "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        pvVar14 = local_268;
                        pvVar11 = (void *)((long)pvVar11 + 1);
                      } while (pvVar11 < local_268);
                      uVar41 = 0;
                      do {
                        piVar12 = immutable::transient_rrb_nth<int,false,6>
                                            ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                             &local_260,(int)uVar41 + (int)pvVar14);
                        TestEq<int,int>(*(uint *)(local_2d8._0_8_ + uVar41 * 4),*piVar12,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x290,
                                        "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        uVar41 = uVar41 + 1;
                      } while (uVar10 != uVar41);
                      immutable::vector<int,_false,_6>::vector
                                ((vector<int,_false,_6> *)&local_208,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_260);
                      uVar24 = rand();
                      pvVar11 = (void *)((ulong)uVar24 % ((ulong)pvVar14 & 0xffffffff));
                      rand();
                      immutable::vector<int,_false,_6>::take
                                ((vector<int,_false,_6> *)local_2b8,(size_type_conflict)&local_290);
                      immutable::vector<int,_false,_6>::drop
                                ((vector<int,_false,_6> *)&local_218,
                                 (size_type_conflict)(vector<int,_false,_6> *)local_2b8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)&local_200,
                                 (ref<immutable::rrb<int,_false,_6>_> *)&local_218);
                      _Var16 = local_260;
                      if (local_200 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_200 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_200 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_260 = local_200;
                      _Var31 = local_260;
                      local_260.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_260.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_2b8._0_4_ =
                           local_260.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_2b8._4_4_ =
                           local_260.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_260 = _Var31;
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_200);
                      uVar41 = 0;
                      do {
                        immutable::transient_rrb_push<int,false,6>
                                  ((immutable *)local_2b8,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_260,
                                   *(uint *)(local_2d8._0_8_ + uVar41 * 4));
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                        uVar41 = uVar41 + 1;
                      } while (uVar10 != uVar41);
                      local_268 = pvVar11;
                      if (local_218 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                      goto LAB_0012f7cc;
                      uVar41 = 0;
                      while (uVar41 < *(uint *)local_218) {
                        index = (uint32_t)uVar41;
                        piVar12 = immutable::transient_rrb_nth<int,false,6>
                                            ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                             &local_260,index);
                        if (local_218 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                        goto LAB_0012f7cc;
                        if (*(uint *)local_218 <= uVar41) goto LAB_0012f7e6;
                        iVar8 = *piVar12;
                        uVar24 = *(uint *)local_218 - *(uint32_t *)((long)local_218 + 8);
                        if (uVar41 < uVar24) {
                          plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                    ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)((long)local_218 + 0x18))->ptr;
                          uVar21 = uVar41 & 0xffffffff;
                          uVar24 = index;
                          for (uVar25 = *(uint32_t *)((long)local_218 + 4); uVar25 != 0;
                              uVar25 = uVar25 - 6) {
                            uVar32 = (uint)uVar21;
                            uVar24 = uVar32 >> ((byte)uVar25 & 0x1f);
                            if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                              plVar38 = (long *)((ulong)((uVar24 & 0x3f) << 3) +
                                                *(long *)(plVar26 + 1));
                            }
                            else {
                              prVar1 = (plVar26->child->_impl).ptr;
                              do {
                                uVar33 = uVar24;
                                uVar24 = uVar33 + 1;
                              } while ((&prVar1->cnt)[uVar33] <= uVar32);
                              if (uVar33 + 1 != 1) {
                                uVar21 = (ulong)(uVar32 - (&prVar1->cnt)[uVar33 - 1]);
                              }
                              plVar38 = (long *)((ulong)uVar33 * 8 + *(long *)(plVar26 + 1));
                            }
                            uVar24 = (uint)uVar21;
                            plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38
                            ;
                          }
                          uVar24 = uVar24 & 0x3f;
                        }
                        else {
                          plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)((long)local_218 + 0x10))->ptr;
                          if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                          goto LAB_0012b6f5;
                          uVar24 = index - uVar24;
                        }
                        iVar39 = *(int *)((long)&(plVar26->child->_impl).ptr + (ulong)uVar24 * 4);
                        TestEq<int,int>(*(uint *)((long)local_1f8 +
                                                 (ulong)((int)local_268 + index) * 4),iVar8,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x2a6,
                                        "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        TestEq<int,int>(iVar39,iVar8,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x2a7,
                                        "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        uVar41 = uVar41 + 1;
                        if (local_218 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                        goto LAB_0012f7cc;
                      }
                      uVar41 = 0;
                      do {
                        if (local_218 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                        goto LAB_0012f7cc;
                        piVar12 = immutable::transient_rrb_nth<int,false,6>
                                            ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                             &local_260,*(uint *)local_218 + (int)uVar41);
                        TestEq<int,int>(*(uint *)(local_2d8._0_8_ + uVar41 * 4),*piVar12,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x2ae,
                                        "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        uVar41 = uVar41 + 1;
                      } while (uVar10 != uVar41);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_218);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_208);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_260);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_290);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        operator_delete((void *)local_2d8._0_8_,(long)_Stack_2c8 - local_2d8._0_8_);
                      }
                      pvVar11 = local_258;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
                      }
                      uVar24 = (int)pvVar11 + 1;
                      pvVar11 = (void *)(ulong)uVar24;
                    } while (uVar24 != 400);
                    piVar12 = (int *)operator_new(40000);
                    lVar28 = 0;
                    memset(piVar12,0,40000);
                    do {
                      iVar8 = rand();
                      *(int *)((long)piVar12 + lVar28) = iVar8;
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 40000);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
                    lVar28 = 0;
                    do {
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_2b8);
                      local_1f8 = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_2d8._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 10000);
                    immutable::transient_vector<int,_false,_6>::transient_vector
                              ((transient_vector<int,_false,_6> *)local_288,
                               (ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                    local_2d8._0_8_ = local_288._0_8_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      uVar24 = (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i;
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i = uVar24 + 1;
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i = uVar24 + 2;
                    }
                    local_1f8 = (undefined1  [8])local_288._0_8_;
                    pvStack_1f0 = (pointer)((ulong)pvStack_1f0 & 0xffffffff00000000);
                    local_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                    local_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                    local_1e0._M_head_impl = (int *)0x0;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::transient_vector<int,_false,_6>::end
                              ((iterator *)local_2d8,(transient_vector<int,_false,_6> *)local_288);
                    if ((pvStack_1f0._0_4_ != local_2d8._8_4_) ||
                       (local_1f8 != (undefined1  [8])local_2d8._0_8_)) {
                      piVar29 = piVar12;
                      do {
                        do {
                          piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                              ((vector_iterator<int,_false,_6> *)local_1f8);
                          TestEq<int,int>(*piVar18,*piVar29,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x2ca,
                                          "void (anonymous namespace)::test_transient_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          _Var9._M_head_impl = pvStack_1f0._0_4_ + 1;
                          pvStack_1f0 = (pointer)CONCAT44(pvStack_1f0._4_4_,_Var9._M_head_impl);
                          piVar29 = piVar29 + 1;
                        } while (_Var9._M_head_impl != local_2d8._8_4_);
                      } while (local_1f8 != (undefined1  [8])local_2d8._0_8_);
                    }
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_288);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                    operator_delete(piVar12,40000);
                    pvVar11 = operator_new(4000);
                    memset(pvVar11,0,4000);
                    pvVar14 = operator_new(4000);
                    memset(pvVar14,0,4000);
                    pvVar15 = operator_new(4000);
                    memset(pvVar15,0,4000);
                    pvVar17 = operator_new(4000);
                    local_58 = (long)pvVar11 + 4000;
                    local_60 = (long)pvVar14 + 4000;
                    lVar28 = 0;
                    memset(pvVar17,0,4000);
                    do {
                      iVar8 = rand();
                      *(int *)((long)pvVar11 + lVar28) = iVar8;
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 4000);
                    lVar28 = 0;
                    do {
                      iVar8 = rand();
                      *(int *)((long)pvVar14 + lVar28) = iVar8;
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 4000);
                    lVar28 = 0;
                    do {
                      iVar8 = rand();
                      *(int *)((long)pvVar15 + lVar28) = iVar8;
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 4000);
                    lVar28 = 0;
                    do {
                      iVar8 = rand();
                      *(int *)((long)pvVar17 + lVar28) = iVar8;
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 4000);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_288);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                    local_210 = pvVar14;
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_2e0);
                    local_268 = pvVar15;
                    local_230 = pvVar11;
                    local_68 = (long)pvVar15 + 4000;
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_290);
                    local_70 = (long)pvVar17 + 4000;
                    lVar28 = 0;
                    local_258 = pvVar17;
                    do {
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_288);
                      local_1f8 = (undefined1  [8])local_288._0_8_;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_288._0_8_ = local_2d8._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_250)
                      ;
                      local_1f8 = (undefined1  [8])local_250._impl;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_250._impl.ptr = (rrb<char,_false,_6> *)local_2d8._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_2e0)
                      ;
                      _Var16 = local_2e0;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_2d8._4_4_;
                      _Var31 = local_2e0;
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0 = _Var31;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_290)
                      ;
                      _Var16 = local_290;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_290.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                      local_290.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_2d8._4_4_;
                      _Var31 = local_290;
                      local_290.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_290.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_290.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_290.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_290 = _Var31;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      pvVar11 = local_230;
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 1000);
                    local_2b8._0_4_ = (_Head_base<2UL,_unsigned_int,_false>)0x0;
                    local_2b8._4_4_ = 0;
                    _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)0x0;
                    _Stack_2b0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                    local_2a8.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)0x0;
                    local_2a8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                    std::vector<int,std::allocator<int>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              ((vector<int,std::allocator<int>> *)local_2b8,0,local_230,local_58);
                    pvVar14 = local_210;
                    std::vector<int,std::allocator<int>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_210,
                               local_60);
                    std::vector<int,std::allocator<int>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_268,
                               local_68);
                    std::vector<int,std::allocator<int>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_258,
                               local_70);
                    immutable::operator+
                              ((immutable *)local_2d8,(vector<int,_false,_6> *)local_288,
                               (vector<int,_false,_6> *)&local_250);
                    immutable::operator+
                              ((immutable *)local_1f8,(vector<int,_false,_6> *)local_2d8,
                               (vector<int,_false,_6> *)&local_2e0);
                    immutable::operator+
                              ((immutable *)&local_260,(vector<int,_false,_6> *)local_1f8,
                               (vector<int,_false,_6> *)&local_290);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::transient_vector<int,_false,_6>::transient_vector
                              ((transient_vector<int,_false,_6> *)&local_208,
                               (ref<immutable::rrb<int,_false,_6>_> *)&local_260);
                    _Var16 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8;
                    local_2d8._0_4_ =
                         local_208.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_2d8._4_4_ =
                         local_208.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    if (local_208 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      uVar24 = (((atomic<unsigned_int> *)((long)local_208 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i;
                      (((atomic<unsigned_int> *)((long)local_208 + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i = uVar24 + 1;
                      (((atomic<unsigned_int> *)((long)local_208 + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i = uVar24 + 2;
                    }
                    local_1f8._0_4_ =
                         local_208.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._4_4_ =
                         local_208.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    pvStack_1f0 = (pointer)((ulong)pvStack_1f0 & 0xffffffff00000000);
                    local_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                    local_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                    local_1e0._M_head_impl = (int *)0x0;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::transient_vector<int,_false,_6>::end
                              ((iterator *)local_2d8,(transient_vector<int,_false,_6> *)&local_208);
                    if ((pvStack_1f0._0_4_ != local_2d8._8_4_) ||
                       (local_1f8 != (undefined1  [8])local_2d8._0_8_)) {
                      do {
                        do {
                          piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                              ((vector_iterator<int,_false,_6> *)local_1f8);
                          TestEq<int,int>(*piVar18,*(uint *)_Var16,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x2f6,
                                          "void (anonymous namespace)::test_transient_iterator_2(uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          _Var9._M_head_impl = pvStack_1f0._0_4_ + 1;
                          pvStack_1f0 = (pointer)CONCAT44(pvStack_1f0._4_4_,_Var9._M_head_impl);
                          _Var16 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)((long)_Var16 + 4);
                        } while (_Var9._M_head_impl != local_2d8._8_4_);
                      } while (local_1f8 != (undefined1  [8])local_2d8._0_8_);
                    }
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_208);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_260);
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      operator_delete((void *)local_2b8,(long)local_2a8 - (long)local_2b8);
                    }
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_290);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_2e0);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                    operator_delete(local_258,4000);
                    operator_delete(local_268,4000);
                    operator_delete(pvVar14,4000);
                    operator_delete(pvVar11,4000);
                    piVar12 = (int *)operator_new(40000);
                    lVar28 = 0;
                    memset(piVar12,0,40000);
                    do {
                      iVar8 = rand();
                      *(int *)((long)piVar12 + lVar28) = iVar8;
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 40000);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
                    lVar28 = 0;
                    do {
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_2b8);
                      local_1f8 = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_2d8._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 10000);
                    memmove(piVar12 + 0x9c4,piVar12 + 5000,20000);
                    immutable::vector<int,_false,_6>::erase
                              ((vector<int,_false,_6> *)local_2d8,(size_type_conflict)local_2b8,
                               0x9c4);
                    local_1f8 = local_2b8;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2b8 = (undefined1  [8])local_2d8._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::transient_vector<int,_false,_6>::transient_vector
                              ((transient_vector<int,_false,_6> *)local_288,
                               (ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                    local_2d8._0_8_ = local_288._0_8_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      uVar24 = (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i;
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i = uVar24 + 1;
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i = uVar24 + 2;
                    }
                    local_1f8 = (undefined1  [8])local_288._0_8_;
                    pvStack_1f0 = (pointer)((ulong)pvStack_1f0 & 0xffffffff00000000);
                    local_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                    local_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                    local_1e0._M_head_impl = (int *)0x0;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::transient_vector<int,_false,_6>::end
                              ((iterator *)local_2d8,(transient_vector<int,_false,_6> *)local_288);
                    if ((pvStack_1f0._0_4_ != local_2d8._8_4_) ||
                       (local_1f8 != (undefined1  [8])local_2d8._0_8_)) {
                      piVar29 = piVar12;
                      do {
                        do {
                          piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                              ((vector_iterator<int,_false,_6> *)local_1f8);
                          TestEq<int,int>(*piVar18,*piVar29,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x314,
                                          "void (anonymous namespace)::test_transient_iterator_3(uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          _Var9._M_head_impl = pvStack_1f0._0_4_ + 1;
                          pvStack_1f0 = (pointer)CONCAT44(pvStack_1f0._4_4_,_Var9._M_head_impl);
                          piVar29 = piVar29 + 1;
                        } while (_Var9._M_head_impl != local_2d8._8_4_);
                      } while (local_1f8 != (undefined1  [8])local_2d8._0_8_);
                    }
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_288);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                    operator_delete(piVar12,40000);
                    pvVar11 = operator_new(40000);
                    lVar28 = 0;
                    memset(pvVar11,0,40000);
                    do {
                      iVar8 = rand();
                      *(int *)((long)pvVar11 + lVar28) = iVar8;
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 40000);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                    lVar28 = 0;
                    do {
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_250)
                      ;
                      local_1f8 = (undefined1  [8])local_250._impl;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_250._impl.ptr = (rrb<char,_false,_6> *)local_2d8._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 10000);
                    immutable::transient_vector<int,_false,_6>::transient_vector
                              ((transient_vector<int,_false,_6> *)&local_2e0,
                               (ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                    immutable::transient_vector<int,_false,_6>::rbegin
                              ((reverse_iterator *)local_2b8,
                               (transient_vector<int,_false,_6> *)&local_2e0);
                    immutable::transient_vector<int,_false,_6>::rend
                              ((reverse_iterator *)local_288,
                               (transient_vector<int,_false,_6> *)&local_2e0);
                    piVar12 = (int *)((long)pvVar11 + 0x9c3c);
                    while( true ) {
                      uVar5 = local_288._8_4_;
                      uVar3 = local_288._0_8_;
                      auVar4 = local_2b8;
                      local_1f8 = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_1e0._M_head_impl = local_2a0._M_head_impl;
                      pvStack_1f0 = (pointer)_Stack_2b0;
                      pvVar6 = pvStack_1f0;
                      local_1e8 = local_2a8;
                      local_2d8._0_8_ = local_288._0_8_;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2c0._M_head_impl = local_270._M_head_impl;
                      local_2d8._12_4_ = local_288._12_4_;
                      local_2d8._8_4_ = local_288._8_4_;
                      _Stack_2c8 = _Stack_278;
                      pvStack_1f0._0_4_ =
                           (uint)_Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      _Var9._M_head_impl = pvStack_1f0._0_4_;
                      pvStack_1f0 = pvVar6;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      if ((auVar4 == (undefined1  [8])uVar3) && (_Var9._M_head_impl == uVar5))
                      break;
                      piVar19 = std::reverse_iterator<immutable::vector_iterator<int,_false,_6>_>::
                                operator*((reverse_iterator<immutable::vector_iterator<int,_false,_6>_>
                                           *)local_2b8);
                      TestEq<int,int>(*piVar19,*piVar12,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x32f,
                                      "void (anonymous namespace)::test_transient_reverse_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                                     );
                      _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)
                           ((int)_Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + -1);
                      piVar12 = piVar12 + -1;
                    }
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                    operator_delete(pvVar11,40000);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                    iVar8 = 400;
                    do {
                      rand();
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_250)
                      ;
                      local_1f8 = (undefined1  [8])local_250._impl;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_250._impl.ptr = (rrb<char,_false,_6> *)local_2d8._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      iVar8 = iVar8 + -1;
                    } while (iVar8 != 0);
                    std::
                    vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                    ::vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                              *)local_1f8,0x35,(allocator_type *)local_2d8);
                    lVar28 = 0;
                    do {
                      rand();
                      rand();
                      immutable::vector<int,_false,_6>::take
                                ((vector<int,_false,_6> *)local_288,(size_type_conflict)&local_250);
                      immutable::vector<int,_false,_6>::drop
                                ((vector<int,_false,_6> *)local_2b8,
                                 (size_type_conflict)(vector<int,_false,_6> *)local_288);
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2d8._0_8_ =
                           *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                            ((long)local_1f8 + lVar28 * 8);
                      p_Var22 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                ((long)local_1f8 + lVar28 * 8);
                      p_Var22->super__Tuple_impl<2UL,_unsigned_int> =
                           (_Tuple_impl<2UL,_unsigned_int>)local_2b8._0_4_;
                      p_Var22->super__Head_base<1UL,_unsigned_int,_false> =
                           (_Head_base<1UL,_unsigned_int,_false>)local_2b8._4_4_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 0x35);
                    pvVar11 = (void *)0x0;
                    do {
                      local_268 = pvVar11;
                      uVar24 = rand();
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_2e0);
                      uVar10 = (ulong)(uVar24 % 10);
                      std::
                      vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                      ::vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                                *)local_2d8,uVar10,(allocator_type *)local_2b8);
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b8,
                                 uVar10,(allocator_type *)local_288);
                      if (uVar24 % 10 != 0) {
                        uVar41 = 0;
                        do {
                          uVar24 = rand();
                          *(uint *)((long)local_2b8 + uVar41 * 4) = uVar24 % 0x35;
                          immutable::operator+
                                    ((immutable *)&local_290,(vector<int,_false,_6> *)&local_2e0,
                                     (vector<int,_false,_6> *)
                                     ((ulong)*(uint *)((long)local_2b8 + uVar41 * 4) * 8 +
                                     (long)local_1f8));
                          _Var16 = local_2e0;
                          if (local_290 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)((long)local_290 + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)((long)local_290 + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_2e0 = local_290;
                          _Var31 = local_2e0;
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_288._0_4_ =
                               local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_288._4_4_ =
                               local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0 = _Var31;
                          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<int,_false,_6>_> *)&local_290);
                          if (local_2e0 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_288._0_8_ =
                               *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                (local_2d8._0_8_ + uVar41 * 8);
                          *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                           (local_2d8._0_8_ + uVar41 * 8) = local_2e0;
                          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                          uVar41 = uVar41 + 1;
                        } while (uVar10 != uVar41);
                      }
                      if (local_2e0 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                      goto LAB_0012f7cc;
                      uVar10 = 0;
                      uVar24 = 0;
                      while (pvVar11 = local_268, uVar24 < *(uint *)local_2e0) {
                        local_288._0_8_ =
                             *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                              ((long)local_1f8 + (ulong)*(uint *)((long)local_2b8 + uVar10 * 4) * 8)
                        ;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ ==
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                        uVar25 = 0;
                        while (uVar25 < *(uint *)local_288._0_8_) {
                          uVar33 = *(uint *)local_288._0_8_ - *(uint32_t *)(local_288._0_8_ + 8);
                          uVar32 = uVar25 - uVar33;
                          if (uVar25 < uVar33) {
                            plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                      ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                        *)(local_288._0_8_ + 0x18))->ptr;
                            uVar32 = uVar25;
                            for (uVar33 = *(uint32_t *)(local_288._0_8_ + 4); uVar33 != 0;
                                uVar33 = uVar33 - 6) {
                              uVar34 = uVar32 >> ((byte)uVar33 & 0x1f);
                              if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                                plVar38 = (long *)((ulong)((uVar34 & 0x3f) << 3) +
                                                  *(long *)(plVar26 + 1));
                              }
                              else {
                                prVar1 = (plVar26->child->_impl).ptr;
                                do {
                                  uVar35 = uVar34;
                                  uVar34 = uVar35 + 1;
                                } while ((&prVar1->cnt)[uVar35] <= uVar32);
                                if (uVar35 + 1 != 1) {
                                  uVar32 = uVar32 - (&prVar1->cnt)[uVar35 - 1];
                                }
                                plVar38 = (long *)((ulong)uVar35 * 8 + *(long *)(plVar26 + 1));
                              }
                              plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                        *plVar38;
                            }
                            uVar32 = uVar32 & 0x3f;
                          }
                          else {
                            plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                        *)(local_288._0_8_ + 0x10))->ptr;
                            if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0
                               ) goto LAB_0012b6f5;
                          }
                          if (local_2e0 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                          goto LAB_0012f7cc;
                          if (*(uint *)local_2e0 <= uVar24) goto LAB_0012f7e6;
                          uVar34 = *(uint *)local_2e0 - *(uint32_t *)((long)local_2e0 + 8);
                          uVar33 = uVar24 - uVar34;
                          if (uVar24 < uVar34) {
                            plVar27 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                      ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                        *)((long)local_2e0 + 0x18))->ptr;
                            uVar33 = uVar24;
                            for (uVar34 = *(uint32_t *)((long)local_2e0 + 4); uVar34 != 0;
                                uVar34 = uVar34 - 6) {
                              uVar35 = uVar33 >> ((byte)uVar34 & 0x1f);
                              if (plVar27->child == (vector<char,_false,_6> *)0x0) {
                                plVar38 = (long *)((ulong)((uVar35 & 0x3f) << 3) +
                                                  *(long *)(plVar27 + 1));
                              }
                              else {
                                prVar1 = (plVar27->child->_impl).ptr;
                                do {
                                  uVar36 = uVar35;
                                  uVar35 = uVar36 + 1;
                                } while ((&prVar1->cnt)[uVar36] <= uVar33);
                                if (uVar36 + 1 != 1) {
                                  uVar33 = uVar33 - (&prVar1->cnt)[uVar36 - 1];
                                }
                                plVar38 = (long *)((ulong)uVar36 * 8 + *(long *)(plVar27 + 1));
                              }
                              plVar27 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                        *plVar38;
                            }
                            uVar33 = uVar33 & 0x3f;
                          }
                          else {
                            plVar27 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                        *)((long)local_2e0 + 0x10))->ptr;
                            if (plVar27 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0
                               ) goto LAB_0012b6f5;
                          }
                          TestEq<int,int>(*(int *)((long)&(plVar26->child->_impl).ptr +
                                                  (ulong)uVar32 * 4),
                                          *(int *)((long)&(plVar27->child->_impl).ptr +
                                                  (ulong)uVar33 * 4),
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x35b,
                                          "void (anonymous namespace)::test_catslice(uint32_t, uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          uVar25 = uVar25 + 1;
                          uVar24 = uVar24 + 1;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ ==
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                        }
                        uVar10 = (ulong)((int)uVar10 + 1);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                        if (local_2e0 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                        goto LAB_0012f7cc;
                      }
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        operator_delete((void *)local_2b8,(long)local_2a8 - (long)local_2b8);
                      }
                      std::
                      vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                      ::~vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                                 *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_2e0);
                      uVar24 = (int)pvVar11 + 1;
                      pvVar11 = (void *)(ulong)uVar24;
                    } while (uVar24 != 0x906);
                    std::
                    vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                    ::~vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                               *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                    std::
                    vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                    ::vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                              *)local_1f8,0xa28,(allocator_type *)local_2d8);
                    lVar28 = 0;
                    do {
                      uVar24 = rand();
                      for (uVar24 = uVar24 & 0xf; uVar24 != 0; uVar24 = uVar24 - 1) {
                        _Var2.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             local_1f8._0_4_;
                        rand();
                        immutable::vector<int,_false,_6>::push_back
                                  ((vector<int,_false,_6> *)local_2b8,
                                   (int)lVar28 * 8 +
                                   (int)_Var2.super__Head_base<2UL,_unsigned_int,_false>.
                                        _M_head_impl);
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2d8._0_8_ =
                             *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                              ((long)local_1f8 + lVar28 * 8);
                        p_Var22 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                  ((long)local_1f8 + lVar28 * 8);
                        p_Var22->super__Tuple_impl<2UL,_unsigned_int> =
                             (_Tuple_impl<2UL,_unsigned_int>)local_2b8._0_4_;
                        p_Var22->super__Head_base<1UL,_unsigned_int,_false> =
                             (_Head_base<1UL,_unsigned_int,_false>)local_2b8._4_4_;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      }
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 200);
                    lVar28 = 0;
                    do {
                      immutable::operator+
                                ((immutable *)local_2b8,
                                 (vector<int,_false,_6> *)((long)local_1f8 + lVar28),
                                 (vector<int,_false,_6> *)((char *)((long)local_1f8 + lVar28) + 8));
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2d8._0_8_ =
                           *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                            ((long)&((rrb<immutable::vector<char,_false,_6>,_true,_5> *)
                                    ((long)local_1f8 + 0x640))->cnt + lVar28);
                      p_Var22 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                ((long)&((rrb<immutable::vector<char,_false,_6>,_true,_5> *)
                                        ((long)local_1f8 + 0x640))->cnt + lVar28);
                      p_Var22->super__Tuple_impl<2UL,_unsigned_int> =
                           (_Tuple_impl<2UL,_unsigned_int>)local_2b8._0_4_;
                      p_Var22->super__Head_base<1UL,_unsigned_int,_false> =
                           (_Head_base<1UL,_unsigned_int,_false>)local_2b8._4_4_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      lVar28 = lVar28 + 8;
                    } while (lVar28 != 0x4b00);
                    lVar28 = 200;
                    do {
                      local_2d8._0_8_ =
                           *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                            ((long)local_1f8 + lVar28 * 8);
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = *(undefined1 (*) [8])
                                   (&((rrb<immutable::vector<char,_false,_6>,_true,_5> *)
                                     ((long)local_1f8 + -0x640))->cnt + lVar28 * 2);
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_288._0_8_ =
                           *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                            ((uint32_t *)((long)local_1f8 + -0x638) + lVar28 * 2);
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 ==
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                      uVar24 = 0;
                      while (uVar24 < *(uint *)local_2b8) {
                        uVar32 = *(uint *)local_2b8 - *(uint32_t *)((long)local_2b8 + 8);
                        uVar25 = uVar24 - uVar32;
                        if (uVar24 < uVar32) {
                          plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                    ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)((long)local_2b8 + 0x18))->ptr;
                          uVar25 = uVar24;
                          for (uVar32 = *(uint32_t *)((long)local_2b8 + 4); uVar32 != 0;
                              uVar32 = uVar32 - 6) {
                            uVar33 = uVar25 >> ((byte)uVar32 & 0x1f);
                            if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                              plVar38 = (long *)((ulong)((uVar33 & 0x3f) << 3) +
                                                *(long *)(plVar26 + 1));
                            }
                            else {
                              prVar1 = (plVar26->child->_impl).ptr;
                              do {
                                uVar34 = uVar33;
                                uVar33 = uVar34 + 1;
                              } while ((&prVar1->cnt)[uVar34] <= uVar25);
                              if (uVar34 + 1 != 1) {
                                uVar25 = uVar25 - (&prVar1->cnt)[uVar34 - 1];
                              }
                              plVar38 = (long *)((ulong)uVar34 * 8 + *(long *)(plVar26 + 1));
                            }
                            plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38
                            ;
                          }
                          uVar25 = uVar25 & 0x3f;
                        }
                        else {
                          plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)((long)local_2b8 + 0x10))->ptr;
                          if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                          goto LAB_0012b6f5;
                        }
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                        if (*(uint *)local_2d8._0_8_ <= uVar24) goto LAB_0012f7e6;
                        uVar33 = *(uint *)local_2d8._0_8_ - *(uint32_t *)(local_2d8._0_8_ + 8);
                        uVar32 = uVar24 - uVar33;
                        if (uVar24 < uVar33) {
                          plVar27 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                    ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)(local_2d8._0_8_ + 0x18))->ptr;
                          uVar32 = uVar24;
                          for (uVar33 = *(uint32_t *)(local_2d8._0_8_ + 4); uVar33 != 0;
                              uVar33 = uVar33 - 6) {
                            uVar34 = uVar32 >> ((byte)uVar33 & 0x1f);
                            if (plVar27->child == (vector<char,_false,_6> *)0x0) {
                              plVar38 = (long *)((ulong)((uVar34 & 0x3f) << 3) +
                                                *(long *)(plVar27 + 1));
                            }
                            else {
                              prVar1 = (plVar27->child->_impl).ptr;
                              do {
                                uVar35 = uVar34;
                                uVar34 = uVar35 + 1;
                              } while ((&prVar1->cnt)[uVar35] <= uVar32);
                              if (uVar35 + 1 != 1) {
                                uVar32 = uVar32 - (&prVar1->cnt)[uVar35 - 1];
                              }
                              plVar38 = (long *)((ulong)uVar35 * 8 + *(long *)(plVar27 + 1));
                            }
                            plVar27 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38
                            ;
                          }
                          uVar32 = uVar32 & 0x3f;
                        }
                        else {
                          plVar27 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)(local_2d8._0_8_ + 0x10))->ptr;
                          if (plVar27 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                          goto LAB_0012b6f5;
                        }
                        TestEq<int,int>(*(int *)((long)&(plVar26->child->_impl).ptr +
                                                (ulong)uVar25 * 4),
                                        *(int *)((long)&(plVar27->child->_impl).ptr +
                                                (ulong)uVar32 * 4),
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x37e,
                                        "void (anonymous namespace)::test_fibocat(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        uVar24 = uVar24 + 1;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 ==
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                      }
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ ==
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                      uVar25 = 0;
                      while (uVar25 < *(uint *)local_288._0_8_) {
                        uVar33 = *(uint *)local_288._0_8_ - *(uint32_t *)(local_288._0_8_ + 8);
                        uVar32 = uVar25 - uVar33;
                        if (uVar25 < uVar33) {
                          plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                    ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)(local_288._0_8_ + 0x18))->ptr;
                          uVar32 = uVar25;
                          for (uVar33 = *(uint32_t *)(local_288._0_8_ + 4); uVar33 != 0;
                              uVar33 = uVar33 - 6) {
                            uVar34 = uVar32 >> ((byte)uVar33 & 0x1f);
                            if (plVar26->child == (vector<char,_false,_6> *)0x0) {
                              plVar38 = (long *)((ulong)((uVar34 & 0x3f) << 3) +
                                                *(long *)(plVar26 + 1));
                            }
                            else {
                              prVar1 = (plVar26->child->_impl).ptr;
                              do {
                                uVar35 = uVar34;
                                uVar34 = uVar35 + 1;
                              } while ((&prVar1->cnt)[uVar35] <= uVar32);
                              if (uVar35 + 1 != 1) {
                                uVar32 = uVar32 - (&prVar1->cnt)[uVar35 - 1];
                              }
                              plVar38 = (long *)((ulong)uVar35 * 8 + *(long *)(plVar26 + 1));
                            }
                            plVar26 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38
                            ;
                          }
                          uVar32 = uVar32 & 0x3f;
                        }
                        else {
                          plVar26 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)(local_288._0_8_ + 0x10))->ptr;
                          if (plVar26 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                          goto LAB_0012b6f5;
                        }
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                        if (*(uint *)local_2d8._0_8_ <= uVar24) goto LAB_0012f7e6;
                        uVar34 = *(uint *)local_2d8._0_8_ - *(uint32_t *)(local_2d8._0_8_ + 8);
                        uVar33 = uVar24 - uVar34;
                        if (uVar24 < uVar34) {
                          plVar27 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)
                                    ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)(local_2d8._0_8_ + 0x18))->ptr;
                          uVar33 = uVar24;
                          for (uVar34 = *(uint32_t *)(local_2d8._0_8_ + 4); uVar34 != 0;
                              uVar34 = uVar34 - 6) {
                            uVar35 = uVar33 >> ((byte)uVar34 & 0x1f);
                            if (plVar27->child == (vector<char,_false,_6> *)0x0) {
                              plVar38 = (long *)((ulong)((uVar35 & 0x3f) << 3) +
                                                *(long *)(plVar27 + 1));
                            }
                            else {
                              prVar1 = (plVar27->child->_impl).ptr;
                              do {
                                uVar36 = uVar35;
                                uVar35 = uVar36 + 1;
                              } while ((&prVar1->cnt)[uVar36] <= uVar33);
                              if (uVar36 + 1 != 1) {
                                uVar33 = uVar33 - (&prVar1->cnt)[uVar36 - 1];
                              }
                              plVar38 = (long *)((ulong)uVar36 * 8 + *(long *)(plVar27 + 1));
                            }
                            plVar27 = (leaf_node<immutable::vector<char,_false,_6>,_true> *)*plVar38
                            ;
                          }
                          uVar33 = uVar33 & 0x3f;
                        }
                        else {
                          plVar27 = ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                                      *)(local_2d8._0_8_ + 0x10))->ptr;
                          if (plVar27 == (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0)
                          goto LAB_0012b6f5;
                        }
                        TestEq<int,int>(*(int *)((long)&(plVar26->child->_impl).ptr +
                                                (ulong)uVar32 * 4),
                                        *(int *)((long)&(plVar27->child->_impl).ptr +
                                                (ulong)uVar33 * 4),
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x385,
                                        "void (anonymous namespace)::test_fibocat(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        uVar25 = uVar25 + 1;
                        uVar24 = uVar24 + 1;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ ==
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012f7cc;
                      }
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 0xa28);
                    std::
                    vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                    ::~vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                               *)local_1f8);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                    immutable::transient_vector<int,_false,_6>::transient_vector
                              ((transient_vector<int,_false,_6> *)local_2b8,
                               (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::transient_rrb_push<int,false,6>
                              ((immutable *)local_1f8,
                               (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,0);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                    immutable::transient_rrb_push<int,false,6>
                              ((immutable *)local_1f8,
                               (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,1);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                    immutable::transient_rrb_push<int,false,6>
                              ((immutable *)local_1f8,
                               (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,2);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                    immutable::vector<int,_false,_6>::vector
                              ((vector<int,_false,_6> *)local_288,
                               (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                    local_1f8 = (undefined1  [8])local_2d8._0_8_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2d8._0_8_ = local_288._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_288);
                    immutable::transient_rrb_push<int,false,6>
                              ((immutable *)&local_38,
                               (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,3);
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref(&local_38);
                    TestEq<bool,bool>(true,false,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x39c,
                                      "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                                     );
                    piVar13 = immutable::vector<int,_false,_6>::at
                                        ((vector<int,_false,_6> *)local_2d8,0);
                    TestEq<int,int>(0,*piVar13,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                    ,0x39d,
                                    "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                                   );
                    piVar13 = immutable::vector<int,_false,_6>::at
                                        ((vector<int,_false,_6> *)local_2d8,1);
                    TestEq<int,int>(1,*piVar13,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                    ,0x39e,
                                    "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                                   );
                    piVar13 = immutable::vector<int,_false,_6>::at
                                        ((vector<int,_false,_6> *)local_2d8,2);
                    TestEq<int,int>(2,*piVar13,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                    ,0x39f,
                                    "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                                   );
                    immutable::vector<int,_false,_6>::at((vector<int,_false,_6> *)local_2d8,3);
                    TestEq<bool,bool>(true,false,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x3a9,
                                      "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                                     );
                    immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    test_erase<false,6>(10000,0x9c4);
                    test_concat<false,6>(2000);
                    immutable::vector<char,_false,_6>::vector((vector<char,_false,_6> *)local_2b8);
                    immutable::vector<immutable::vector<char,_false,_6>,_true,_5>::vector
                              ((vector<immutable::vector<char,_false,_6>,_true,_5> *)local_288);
                    iVar8 = 0;
                    do {
                      iVar39 = 3;
                      do {
                        immutable::vector<char,_false,_6>::push_back
                                  ((vector<char,_false,_6> *)local_2d8,(value_type)local_2b8);
                        local_1f8 = local_2b8;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2b8 = (undefined1  [8])local_2d8._0_8_;
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                        iVar39 = iVar39 + -1;
                      } while (iVar39 != 0);
                      local_250._impl.ptr = (rrb<char,_false,_6> *)local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      immutable::vector<immutable::vector<char,_false,_6>,_true,_5>::push_back
                                ((vector<immutable::vector<char,_false,_6>,_true,_5> *)local_1f8,
                                 (value_type *)local_288);
                      immutable::ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_>::
                      operator=((ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *)
                                local_288,
                                (ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *)
                                local_1f8);
                      immutable::rrb_details::release<immutable::vector<char,false,6>,5>
                                ((rrb<immutable::vector<char,_false,_6>,_true,_5> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref(&local_250._impl);
                      iVar8 = iVar8 + 1;
                    } while (iVar8 != 0x1e);
                    p_Var22 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                              immutable::vector<immutable::vector<char,_false,_6>,_true,_5>::back
                                        ((vector<immutable::vector<char,_false,_6>,_true,_5> *)
                                         local_288);
                    local_1f8 = *(undefined1 (*) [8])p_Var22;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8 !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      *(uint *)((long)local_1f8 + 0x20) = *(uint *)((long)local_1f8 + 0x20) + 1;
                    }
                    pvStack_1f0 = (pointer)((ulong)pvStack_1f0 & 0xffffffff00000000);
                    local_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                    local_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                    local_1e0._M_head_impl = (int *)0x0;
                    immutable::vector_iterator<char,_false,_6>::vector_iterator
                              ((vector_iterator<char,_false,_6> *)local_2d8,p_Var22);
                    _Var9._M_head_impl = pvStack_1f0._0_4_;
                    while ((_Var9._M_head_impl != local_2d8._8_4_ ||
                           (local_1f8 != (undefined1  [8])local_2d8._0_8_))) {
                      pcVar23 = immutable::vector_iterator<char,_false,_6>::operator*
                                          ((vector_iterator<char,_false,_6> *)local_1f8);
                      TestEq<char,char>('a',*pcVar23,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x3bb,
                                        "void (anonymous namespace)::test_vector_of_vector() [atomic_ref_counting = false, N = 6]"
                                       );
                      _Var9._M_head_impl = pvStack_1f0._0_4_ + 1;
                      pvStack_1f0 = (pointer)CONCAT44(pvStack_1f0._4_4_,_Var9._M_head_impl);
                    }
                    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                              ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                              ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                    immutable::rrb_details::release<immutable::vector<char,false,6>,5>
                              ((rrb<immutable::vector<char,_false,_6>,_true,_5> *)local_288._0_8_);
                    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                              ((ref<immutable::rrb<char,_false,_6>_> *)local_2b8);
                    immutable::vector<char,_false,_6>::vector((vector<char,_false,_6> *)&local_2e0);
                    immutable::vector<char,_false,_6>::vector((vector<char,_false,_6> *)&local_290);
                    immutable::transient_vector<char,_false,_6>::transient_vector
                              ((transient_vector<char,_false,_6> *)&local_260,
                               (ref<immutable::rrb<char,_false,_6>_> *)&local_290);
                    local_2d8._0_8_ = &_Stack_2c8;
                    local_1f8._0_4_ = (_Head_base<2UL,_unsigned_int,_false>)0x1b;
                    local_1f8._4_4_ = 0;
                    _Var16 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)
                             std::__cxx11::string::_M_create((ulong *)local_2d8,(ulong)local_1f8);
                    auVar4 = local_1f8;
                    _Stack_2c8.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)local_1f8._0_4_;
                    _Stack_2c8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         local_1f8._4_4_;
                    builtin_strncpy((char *)((long)_Var16 + 0xb)," eerste ",8);
                    builtin_strncpy((char *)((long)_Var16 + 0x13),"lijntje ",8);
                    *(undefined8 *)_Var16 = 0x6d20736920746944;
                    *(undefined8 *)((long)_Var16 + 8) = 0x73726565206e6a69;
                    local_2d8._8_8_ = local_1f8;
                    *(char *)((long)_Var16 + (long)local_1f8) = '\0';
                    local_2d8._0_8_ = _Var16;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8 !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      _Var31.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)0x0;
                      _Var31.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                      do {
                        immutable::transient_rrb_push<char,false,6>
                                  ((immutable *)local_1f8,
                                   (ref<immutable::transient_rrb<char,_false,_6>_> *)&local_260,
                                   *(char *)((long)_Var16 + (long)_Var31));
                        immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<char,_false,_6>_> *)local_1f8);
                        _Var31 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)((long)_Var31 + 1);
                      } while ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)auVar4 != _Var31);
                    }
                    immutable::vector<char,_false,_6>::vector
                              ((vector<char,_false,_6> *)local_2b8,
                               (ref<immutable::transient_rrb<char,_false,_6>_> *)&local_260);
                    _Var16 = local_290;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_290.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)local_2b8._0_4_;
                    local_290.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         local_2b8._4_4_;
                    _Var31 = local_290;
                    local_290.super__Tuple_impl<2UL,_unsigned_int> =
                         _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_290.super__Head_base<1UL,_unsigned_int,_false> =
                         _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._0_4_ =
                         local_290.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._4_4_ =
                         local_290.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_290 = _Var31;
                    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                              ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                              ((ref<immutable::rrb<char,_false,_6>_> *)local_2b8);
                    local_208 = local_290;
                    if (local_290 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)((long)local_290 + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)((long)local_290 + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    immutable::vector<char,_false,_6>::insert
                              ((vector<char,_false,_6> *)local_2b8,(size_type_conflict)&local_2e0,
                               (vector<char,_false,_6> *)0x0);
                    _Var16 = local_2e0;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)local_2b8._0_4_;
                    local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         local_2b8._4_4_;
                    _Var31 = local_2e0;
                    local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                         _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                         _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._0_4_ =
                         local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._4_4_ =
                         local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_2e0 = _Var31;
                    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                              ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                              ((ref<immutable::rrb<char,_false,_6>_> *)local_2b8);
                    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                              ((ref<immutable::rrb<char,_false,_6>_> *)&local_208);
                    immutable::vector<char,_false,_6>::vector((vector<char,_false,_6> *)&local_218);
                    immutable::transient_vector<char,_false,_6>::transient_vector
                              ((transient_vector<char,_false,_6> *)&local_200,
                               (ref<immutable::rrb<char,_false,_6>_> *)&local_218);
                    local_1f8._0_4_ = (_Head_base<2UL,_unsigned_int,_false>)0x1b;
                    local_1f8._4_4_ = 0;
                    local_2b8 = (undefined1  [8])&local_2a8;
                    _Var16 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)
                             std::__cxx11::string::_M_create((ulong *)local_2b8,(ulong)local_1f8);
                    auVar4 = local_1f8;
                    local_2a8.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)local_1f8._0_4_;
                    local_2a8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         local_1f8._4_4_;
                    builtin_strncpy((char *)((long)_Var16 + 0xb)," tweede ",8);
                    builtin_strncpy((char *)((long)_Var16 + 0x13),"lijntje ",8);
                    *(undefined8 *)_Var16 = 0x6d20736920746944;
                    *(undefined8 *)((long)_Var16 + 8) = 0x65657774206e6a69;
                    _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)local_1f8._0_4_;
                    _Stack_2b0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         local_1f8._4_4_;
                    *(char *)((long)_Var16 + (long)local_1f8) = '\0';
                    local_2b8 = (undefined1  [8])_Var16;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8 !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      _Var40.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)0x0;
                      _Var40.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                      do {
                        immutable::transient_rrb_push<char,false,6>
                                  ((immutable *)local_1f8,
                                   (ref<immutable::transient_rrb<char,_false,_6>_> *)&local_200,
                                   *(char *)((long)_Var16 + (long)_Var40));
                        immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<char,_false,_6>_> *)local_1f8);
                        _Var40 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)((long)_Var40 + 1);
                      } while ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)auVar4 != _Var40);
                    }
                    immutable::vector<char,_false,_6>::vector
                              ((vector<char,_false,_6> *)local_288,
                               (ref<immutable::transient_rrb<char,_false,_6>_> *)&local_200);
                    _Var16 = local_218;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_218.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                    local_218.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         local_288._4_4_;
                    _Var31 = local_218;
                    local_218.super__Tuple_impl<2UL,_unsigned_int> =
                         _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_218.super__Head_base<1UL,_unsigned_int,_false> =
                         _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._0_4_ =
                         local_218.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._4_4_ =
                         local_218.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_218 = _Var31;
                    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                              ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                              ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                    if (local_2e0 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      uVar24 = *(uint *)local_2e0;
                      local_40 = local_218;
                      if (local_218 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_218 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_218 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      immutable::vector<char,_false,_6>::insert
                                ((vector<char,_false,_6> *)local_288,(size_type_conflict)&local_2e0,
                                 (vector<char,_false,_6> *)(ulong)uVar24);
                      _Var16 = local_2e0;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_2e0;
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_40);
                      immutable::vector<char,_false,_6>::vector
                                ((vector<char,_false,_6> *)&local_228);
                      immutable::vector<char,_false,_6>::push_back
                                ((vector<char,_false,_6> *)local_288,(value_type)&local_228);
                      _Var16 = local_228;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_228.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_228;
                      local_228.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_228.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_228.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_228 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      immutable::vector<char,_false,_6>::push_back
                                ((vector<char,_false,_6> *)local_288,(value_type)&local_228);
                      _Var16 = local_228;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_228.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_228;
                      local_228.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_228.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_228.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_228 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      immutable::vector<char,_false,_6>::push_back
                                ((vector<char,_false,_6> *)local_288,(value_type)&local_228);
                      _Var16 = local_228;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_228.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_228;
                      local_228.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_228.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_228.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_228 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      immutable::vector<char,_false,_6>::push_back
                                ((vector<char,_false,_6> *)local_288,(value_type)&local_228);
                      _Var16 = local_228;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_228.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_228;
                      local_228.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_228.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_228.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_228 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      immutable::vector<char,_false,_6>::push_back
                                ((vector<char,_false,_6> *)local_288,(value_type)&local_228);
                      _Var16 = local_228;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_228.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_228;
                      local_228.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_228.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_228.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_228 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      immutable::vector<char,_false,_6>::push_back
                                ((vector<char,_false,_6> *)local_288,(value_type)&local_228);
                      _Var16 = local_228;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_228.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_228;
                      local_228.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_228.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_228.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_228 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      immutable::vector<char,_false,_6>::erase
                                ((vector<char,_false,_6> *)local_288,(size_type_conflict)&local_2e0,
                                 0);
                      _Var16 = local_2e0;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_2e0;
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      local_48 = local_228;
                      if (local_228 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_228 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_228 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      immutable::vector<char,_false,_6>::insert
                                ((vector<char,_false,_6> *)local_288,(size_type_conflict)&local_2e0,
                                 (vector<char,_false,_6> *)0x0);
                      _Var16 = local_2e0;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_2e0;
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_48);
                      immutable::vector<char,_false,_6>::set
                                ((vector<char,_false,_6> *)local_288,(size_type_conflict)&local_228,
                                 '\0');
                      _Var16 = local_228;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_228.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_228;
                      local_228.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_228.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_228.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_228 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      immutable::vector<char,_false,_6>::erase
                                ((vector<char,_false,_6> *)local_288,(size_type_conflict)&local_2e0,
                                 0x1e);
                      _Var16 = local_2e0;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_2e0;
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      local_50 = local_228;
                      if (local_228 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_228 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_228 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      immutable::vector<char,_false,_6>::insert
                                ((vector<char,_false,_6> *)local_288,(size_type_conflict)&local_2e0,
                                 (vector<char,_false,_6> *)0x1e);
                      _Var16 = local_2e0;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_288._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_288._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_288._0_4_;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_288._4_4_;
                      _Var31 = local_2e0;
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_2e0 = _Var31;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_50);
                      std::__cxx11::stringstream::stringstream((stringstream *)local_1f8);
                      local_288._0_4_ =
                           local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_288._4_4_ =
                           local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      if (local_2e0 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_288._8_4_ = 0;
                      _Stack_278.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                      _Stack_278.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           0xffffffff;
                      local_270._M_head_impl = (int *)0x0;
                      immutable::vector_iterator<char,_false,_6>::vector_iterator
                                (&local_250,&local_2e0);
                      if ((local_288._8_4_ != local_250._index) ||
                         ((rrb<char,_false,_6> *)local_288._0_8_ != local_250._impl.ptr)) {
                        do {
                          do {
                            pcVar23 = immutable::vector_iterator<char,_false,_6>::operator*
                                                ((vector_iterator<char,_false,_6> *)local_288);
                            local_219 = *pcVar23;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_1e8,&local_219,1);
                            local_288._8_4_ = local_288._8_4_ + 1;
                          } while (local_288._8_4_ != local_250._index);
                        } while ((rrb<char,_false,_6> *)local_288._0_8_ != local_250._impl.ptr);
                      }
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref(&local_250._impl);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_288);
                      std::__cxx11::stringbuf::str();
                      iVar8 = std::__cxx11::string::compare(local_288);
                      TestEq<bool,bool>(true,iVar8 == 0,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x3ea,
                                        "void (anonymous namespace)::test_vector_bug_1() [atomic_ref_counting = false, N = 6]"
                                       );
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)local_288._0_8_ !=
                          &_Stack_278) {
                        operator_delete((void *)local_288._0_8_,(long)_Stack_278 + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_228);
                      if (local_2b8 != (undefined1  [8])&local_2a8) {
                        operator_delete((void *)local_2b8,(ulong)((long)local_2a8 + 1));
                      }
                      immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<char,_false,_6>_> *)&local_200);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_218);
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)local_2d8._0_8_ !=
                          &_Stack_2c8) {
                        operator_delete((void *)local_2d8._0_8_,(ulong)((long)_Stack_2c8 + 1));
                      }
                      immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<char,_false,_6>_> *)&local_260);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_290);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                      immutable::vector<char,_false,_6>::vector((vector<char,_false,_6> *)local_2b8)
                      ;
                      immutable::transient_vector<char,_false,_6>::transient_vector
                                ((transient_vector<char,_false,_6> *)local_288,
                                 (ref<immutable::rrb<char,_false,_6>_> *)local_2b8);
                      local_2d8._0_4_ = (_Head_base<2UL,_unsigned_int,_false>)0x74;
                      local_2d8._4_4_ = 0;
                      local_1f8 = (undefined1  [8])&local_1e8;
                      __dest.ptr = (rrb<immutable::vector<char,_false,_6>,_true,_5> *)
                                   std::__cxx11::string::_M_create
                                             ((ulong *)local_1f8,(ulong)local_2d8);
                      uVar3 = local_2d8._0_8_;
                      local_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                      local_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_2d8._4_4_;
                      local_1f8 = (undefined1  [8])__dest.ptr;
                      memcpy(__dest.ptr,
                             "sdflkjkljdsflkjasd;lkfjsadlkfja;sdlkfj;asdlkfjsld;kfjls;dakfjlwefjlwkedflskxnvnv;laskdjfl;kwejfrl;kjsad;lfkfj;lwkejf"
                             ,0x74);
                      auVar4 = local_1f8;
                      pvStack_1f0 = (pointer)uVar3;
                      *(undefined1 *)
                       ((long)&(((_Tuple_impl<2UL,_unsigned_int> *)&(__dest.ptr)->cnt)->
                               super__Head_base<2UL,_unsigned_int,_false>)._M_head_impl + uVar3) = 0
                      ;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)uVar3 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        _Var16.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)0x0;
                        _Var16.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                        do {
                          immutable::transient_rrb_push<char,false,6>
                                    ((immutable *)local_2d8,
                                     (ref<immutable::transient_rrb<char,_false,_6>_> *)local_288,
                                     *(char *)((long)auVar4 + (long)_Var16));
                          immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::transient_rrb<char,_false,_6>_> *)local_2d8);
                          _Var16 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)((long)_Var16 + 1);
                        } while ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)uVar3 != _Var16);
                      }
                      immutable::vector<char,_false,_6>::vector
                                ((vector<char,_false,_6> *)&local_250,
                                 (ref<immutable::transient_rrb<char,_false,_6>_> *)local_288);
                      local_2d8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_250._impl.ptr !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_250._impl.ptr;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref(&local_250._impl);
                      local_2d8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      bVar7 = immutable::validate_rrb<char,false,6>
                                        ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      TestEq<bool,bool>(true,bVar7,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x3fa,
                                        "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                       );
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      immutable::vector<char,_false,_6>::insert
                                ((vector<char,_false,_6> *)&local_250,(size_type_conflict)local_2b8,
                                 '\0');
                      local_2d8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_250._impl.ptr !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_250._impl.ptr;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref(&local_250._impl);
                      immutable::vector<char,_false,_6>::insert
                                ((vector<char,_false,_6> *)&local_250,(size_type_conflict)local_2b8,
                                 '\0');
                      local_2d8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_250._impl.ptr !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_250._impl.ptr;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref(&local_250._impl);
                      immutable::vector<char,_false,_6>::insert
                                ((vector<char,_false,_6> *)&local_250,(size_type_conflict)local_2b8,
                                 '\0');
                      local_2d8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_250._impl.ptr !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_250._impl.ptr;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref(&local_250._impl);
                      immutable::vector<char,_false,_6>::insert
                                ((vector<char,_false,_6> *)&local_250,(size_type_conflict)local_2b8,
                                 '\0');
                      local_2d8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_250._impl.ptr !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_250._impl.ptr;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref(&local_250._impl);
                      immutable::vector<char,_false,_6>::insert
                                ((vector<char,_false,_6> *)&local_250,(size_type_conflict)local_2b8,
                                 '\0');
                      local_2d8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_250._impl.ptr !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_250._impl.ptr;
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref(&local_250._impl);
                      local_2d8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      bVar7 = immutable::validate_rrb<char,false,6>
                                        ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      TestEq<bool,bool>(true,bVar7,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x402,
                                        "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                       );
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      immutable::vector<char,_false,_6>::take
                                ((vector<char,_false,_6> *)local_2d8,(size_type_conflict)local_2b8);
                      immutable::vector<char,_false,_6>::drop
                                ((vector<char,_false,_6> *)&local_250,(size_type_conflict)local_2b8)
                      ;
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_2b8._0_4_;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_2b8._4_4_;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      bVar7 = immutable::validate_rrb<char,false,6>
                                        ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                      TestEq<bool,bool>(true,bVar7,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x407,
                                        "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                       );
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                      local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                      local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_2d8._4_4_;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      bVar7 = immutable::validate_rrb<char,false,6>
                                        ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                      TestEq<bool,bool>(true,bVar7,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x408,
                                        "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                       );
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                      local_2e0 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_250._impl.ptr;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_250._impl.ptr !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_250._impl.ptr + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      bVar7 = immutable::validate_rrb<char,false,6>
                                        ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                      TestEq<bool,bool>(true,bVar7,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x409,
                                        "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                       );
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                      immutable::operator+
                                ((immutable *)&local_2e0,(vector<char,_false,_6> *)local_2d8,
                                 (vector<char,_false,_6> *)&local_250);
                      local_290 = local_2e0;
                      if (local_2e0 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      bVar7 = immutable::validate_rrb<char,false,6>
                                        ((ref<immutable::rrb<char,_false,_6>_> *)&local_290);
                      TestEq<bool,bool>(true,bVar7,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x40d,
                                        "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                       );
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_290);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref(&local_250._impl);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                      if (local_1f8 != (undefined1  [8])&local_1e8) {
                        operator_delete((void *)local_1f8,(ulong)((long)local_1e8 + 1));
                      }
                      immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<char,_false,_6>_> *)local_288);
                      immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                ((ref<immutable::rrb<char,_false,_6>_> *)local_2b8);
                      return;
                    }
                    __function = 
                    "T *immutable::ref<immutable::rrb<char, false, 6>>::operator->() const [T = immutable::rrb<char, false, 6>]"
                    ;
                    goto LAB_0012b70a;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0012f7cc:
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_0012b70a:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

void run_tests()
    {        
    test_empty_vector<atomic_ref_counting, N>();
    test_push_back_simple<atomic_ref_counting, N>();
    test_push_back<atomic_ref_counting, N>();
    test_front<atomic_ref_counting, N>();
    test_back<atomic_ref_counting, N>();
    test_size<atomic_ref_counting, N>();
    test_pop_back<atomic_ref_counting, N>();
    test_update<atomic_ref_counting, N>();
    test_erase_single<atomic_ref_counting, N>();
    test_erase<atomic_ref_counting, N>(200, 50);
    test_insert_single<atomic_ref_counting, N>();
    test_concat<atomic_ref_counting, N>(200);
    test_drop<atomic_ref_counting, N>();
    test_take<atomic_ref_counting, N>();
    test_iterator<atomic_ref_counting, N>();
    test_iterator_2<atomic_ref_counting, N>();
    test_iterator_3<atomic_ref_counting, N>();
    test_reverse_iterator<atomic_ref_counting, N>();
    test_vector_equality<atomic_ref_counting, N>();
    test_insert_vector<atomic_ref_counting, N>();
    test_transient_vector_push<atomic_ref_counting, N>();
    test_transient_vector_pop<atomic_ref_counting, N>();
    test_transient_vector_update<atomic_ref_counting, N>();
    test_transient_vector_push_2<atomic_ref_counting, N>();
    test_transient_iterator<atomic_ref_counting, N>();
    test_transient_iterator_2<atomic_ref_counting, N>();
    test_transient_iterator_3<atomic_ref_counting, N>();
    test_transient_reverse_iterator<atomic_ref_counting, N>();
    test_catslice<atomic_ref_counting, N>();
    test_fibocat<atomic_ref_counting, N>();
    test_invalid_states<atomic_ref_counting, N>();
    test_erase<atomic_ref_counting, N>();
    test_concat<atomic_ref_counting, N>();    
    test_vector_of_vector<atomic_ref_counting, N>();
    test_vector_bug_1<atomic_ref_counting, N>();
    test_bug_concat<atomic_ref_counting, N>();
    }